

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  undefined8 *puVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  ushort uVar22;
  ushort uVar23;
  BVH *bvh;
  Geometry *pGVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  byte bVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar48;
  undefined1 auVar49 [12];
  int iVar50;
  AABBNodeMB4D *node1;
  ulong uVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  RTCIntersectArguments *pRVar57;
  long lVar58;
  undefined4 uVar59;
  RTCIntersectArguments *pRVar60;
  NodeRef NVar61;
  long lVar62;
  long lVar63;
  ulong uVar64;
  NodeRef *pNVar65;
  vfloat<4> *pvVar66;
  vfloat<4> *pvVar67;
  ulong uVar68;
  long lVar69;
  long lVar70;
  ulong uVar71;
  bool bVar72;
  bool bVar73;
  float fVar74;
  float fVar102;
  float fVar103;
  vint4 ai;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar104;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  byte bVar105;
  float fVar106;
  byte bVar126;
  byte bVar127;
  byte bVar129;
  byte bVar130;
  byte bVar131;
  undefined1 auVar107 [16];
  byte bVar128;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar147;
  float fVar149;
  undefined1 auVar135 [16];
  float fVar150;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar148;
  float fVar151;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar145;
  undefined1 auVar146 [16];
  float fVar152;
  float fVar161;
  float fVar163;
  vint4 ai_1;
  undefined1 auVar153 [16];
  float fVar164;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar162;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar165;
  float fVar174;
  float fVar175;
  vint4 ai_3;
  float fVar176;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar177;
  float fVar185;
  float fVar188;
  vint4 bi_3;
  float fVar191;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar192;
  float fVar193;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar194;
  float fVar201;
  float fVar202;
  vint4 bi;
  undefined1 auVar195 [16];
  float fVar203;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar205;
  float fVar212;
  float fVar214;
  vint4 bi_1;
  float fVar216;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar215;
  float fVar217;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar218;
  float fVar219;
  float fVar222;
  uint uVar223;
  float fVar224;
  float fVar225;
  vint4 ai_2;
  undefined1 auVar220 [16];
  uint uVar226;
  undefined1 auVar221 [16];
  float fVar227;
  uint uVar228;
  float fVar229;
  uint uVar232;
  uint uVar234;
  vint4 bi_2;
  uint uVar236;
  undefined1 auVar230 [16];
  float fVar233;
  float fVar235;
  float fVar237;
  undefined1 auVar231 [16];
  uint uVar238;
  float fVar239;
  uint uVar243;
  float fVar244;
  float fVar245;
  uint uVar246;
  float fVar247;
  float fVar248;
  uint uVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar252;
  float fVar253;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  uint uVar263;
  float fVar264;
  uint uVar269;
  float fVar272;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar266;
  float fVar270;
  float fVar271;
  float fVar273;
  undefined1 auVar267 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar268;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  TravRayK<4,_true> *tray_00;
  size_t sVar302;
  Precalculations pre;
  UVIdentity<4> mapUV;
  float fStack_1c30;
  float fStack_1c2c;
  undefined4 uStack_1bec;
  undefined1 local_1be8 [8];
  float fStack_1be0;
  float fStack_1bdc;
  undefined1 local_1bd8 [8];
  int iStack_1bd0;
  int iStack_1bcc;
  vfloat<4> *local_1bc8;
  NodeRef *local_1bc0;
  NodeRef local_1bb8;
  long local_1bb0;
  long local_1ba8;
  uint local_1ba0;
  uint local_1b9c;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  PlueckerHitM<4,_embree::sse42::UVIdentity<4>_> hit;
  float local_19a8 [4];
  undefined1 local_1998 [16];
  undefined1 local_1988 [16];
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  undefined1 local_1968 [16];
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  uint local_1938;
  uint uStack_1934;
  uint uStack_1930;
  uint uStack_192c;
  uint local_1928;
  uint uStack_1924;
  uint uStack_1920;
  uint uStack_191c;
  uint local_1918;
  uint uStack_1914;
  uint uStack_1910;
  uint uStack_190c;
  uint local_1908;
  uint uStack_1904;
  uint uStack_1900;
  uint uStack_18fc;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  vbool<4> valid0;
  TravRayK<4,_true> tray;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_1740;
  float fStack_173c;
  vint<4> itime;
  vfloat<4> ftime;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar265 [16];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar208._8_4_ = 0xffffffff;
    auVar208._0_8_ = 0xffffffffffffffff;
    auVar208._12_4_ = 0xffffffff;
    auVar195 = *(undefined1 (*) [16])(ray + 0x80);
    auVar241._0_12_ = ZEXT812(0);
    auVar241._12_4_ = 0;
    uVar263 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar195._0_4_);
    uVar269 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar195._4_4_);
    auVar265._0_8_ = CONCAT44(uVar269,uVar263);
    auVar265._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar195._8_4_);
    auVar265._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar195._12_4_);
    iVar50 = movmskps((int)bvh,auVar265);
    if (iVar50 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      uVar238 = (uint)DAT_01fec6c0;
      uVar243 = DAT_01fec6c0._4_4_;
      uVar246 = DAT_01fec6c0._8_4_;
      uVar249 = DAT_01fec6c0._12_4_;
      auVar220 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      fVar252 = (float)DAT_01ff1d40;
      fVar257 = DAT_01ff1d40._4_4_;
      fVar259 = DAT_01ff1d40._8_4_;
      fVar261 = DAT_01ff1d40._12_4_;
      auVar135._4_4_ = -(uint)((float)(tray.dir.field_0._4_4_ & uVar243) < fVar257);
      auVar135._0_4_ = -(uint)((float)(tray.dir.field_0._0_4_ & uVar238) < fVar252);
      auVar135._8_4_ = -(uint)((float)(tray.dir.field_0._8_4_ & uVar246) < fVar259);
      auVar135._12_4_ = -(uint)((float)(tray.dir.field_0._12_4_ & uVar249) < fVar261);
      auVar153 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar75._4_4_ = -(uint)((float)(tray.dir.field_0._20_4_ & uVar243) < fVar257);
      auVar75._0_4_ = -(uint)((float)(tray.dir.field_0._16_4_ & uVar238) < fVar252);
      auVar107 = divps(_DAT_01feca10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)blendvps(auVar220,_DAT_0201c930,auVar135);
      auVar75._8_4_ = -(uint)((float)(tray.dir.field_0._24_4_ & uVar246) < fVar259);
      auVar75._12_4_ = -(uint)((float)(tray.dir.field_0._28_4_ & uVar249) < fVar261);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar153,_DAT_0201c930,auVar75)
      ;
      auVar153._4_4_ = -(uint)((float)(tray.dir.field_0._36_4_ & uVar243) < fVar257);
      auVar153._0_4_ = -(uint)((float)(tray.dir.field_0._32_4_ & uVar238) < fVar252);
      auVar153._8_4_ = -(uint)((float)(tray.dir.field_0._40_4_ & uVar246) < fVar259);
      auVar153._12_4_ = -(uint)((float)(tray.dir.field_0._44_4_ & uVar249) < fVar261);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)blendvps(auVar107,_DAT_0201c930,auVar153);
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar107._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar107._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar107._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar107._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar107);
      auVar220._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar220._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar220._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar220._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar220);
      auVar135 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar241);
      fVar252 = (float)DAT_01feb9f0;
      fVar257 = DAT_01feb9f0._4_4_;
      fVar259 = DAT_01feb9f0._8_4_;
      fVar261 = DAT_01feb9f0._12_4_;
      auVar76._8_4_ = auVar265._8_4_;
      auVar76._0_8_ = auVar265._0_8_;
      auVar76._12_4_ = auVar265._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar135,auVar76);
      auVar195 = maxps(auVar195,auVar241);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar195,auVar76);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar208 ^ auVar265);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar238 = 3;
      }
      else {
        uVar238 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar65 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      sVar302 = (bvh->root).ptr;
      stack_node[1].ptr = sVar302;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      pRVar60 = (RTCIntersectArguments *)context;
      pvVar66 = stack_near + 2;
      do {
        pvVar67 = pvVar66 + -1;
        local_1bb8.ptr = pNVar65[-1].ptr;
        pNVar65 = pNVar65 + -1;
        if (local_1bb8.ptr == 0xfffffffffffffff8) {
LAB_0025e3d7:
          sVar302 = 3;
        }
        else {
          fVar162 = (pvVar67->field_0).v[0];
          fVar151 = pvVar66[-1].field_0.v[1];
          fVar133 = pvVar66[-1].field_0.v[2];
          fVar148 = pvVar66[-1].field_0.v[3];
          auVar195._4_4_ = -(uint)(fVar151 < tray.tfar.field_0.v[1]);
          auVar195._0_4_ = -(uint)(fVar162 < tray.tfar.field_0.v[0]);
          auVar195._8_4_ = -(uint)(fVar133 < tray.tfar.field_0.v[2]);
          auVar195._12_4_ = -(uint)(fVar148 < tray.tfar.field_0.v[3]);
          uVar243 = movmskps((int)sVar302,auVar195);
          if (uVar243 == 0) {
LAB_0025e3e8:
            sVar302 = 2;
          }
          else {
            uVar71 = (ulong)(uVar243 & 0xff);
            uVar243 = POPCOUNT(uVar243 & 0xff);
            sVar302 = 0;
            local_1bc8 = pvVar67;
            local_1bc0 = pNVar65;
            if (uVar243 <= uVar238) {
              do {
                sVar302 = 0;
                if (uVar71 != 0) {
                  for (; (uVar71 >> sVar302 & 1) == 0; sVar302 = sVar302 + 1) {
                  }
                }
                tray_00 = &tray;
                valid_i = (vint<4> *)This;
                bVar73 = occluded1(This,bvh,local_1bb8,sVar302,&pre,ray,tray_00,context);
                if (bVar73) {
                  terminated.field_0.i[sVar302] = -1;
                }
                uVar71 = uVar71 & uVar71 - 1;
              } while (uVar71 != 0);
              uVar246 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              pRVar60 = (RTCIntersectArguments *)(ulong)uVar246;
              sVar302 = 3;
              fVar252 = INFINITY;
              fVar257 = INFINITY;
              fVar259 = INFINITY;
              fVar261 = INFINITY;
              pNVar65 = local_1bc0;
              pvVar67 = local_1bc8;
              if (uVar246 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                sVar302 = 2;
              }
            }
            if (uVar238 < uVar243) {
              do {
                if ((local_1bb8.ptr & 8) != 0) {
                  if (local_1bb8.ptr == 0xfffffffffffffff8) goto LAB_0025e3d7;
                  auVar79._4_4_ = -(uint)(fVar151 < tray.tfar.field_0.v[1]);
                  auVar79._0_4_ = -(uint)(fVar162 < tray.tfar.field_0.v[0]);
                  auVar79._8_4_ = -(uint)(fVar133 < tray.tfar.field_0.v[2]);
                  auVar79._12_4_ = -(uint)(fVar148 < tray.tfar.field_0.v[3]);
                  iVar50 = movmskps((int)sVar302,auVar79);
                  if (iVar50 != 0) {
                    lVar52 = (ulong)((uint)local_1bb8.ptr & 0xf) - 8;
                    lVar58 = lVar52;
                    aVar268 = terminated.field_0;
                    if (lVar52 != 0) {
                      NVar61.ptr = local_1bb8.ptr & 0xfffffffffffffff0;
                      aVar266._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                      aVar266._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                      aVar266._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                      lVar58 = 0;
                      local_1bc8 = pvVar67;
                      local_1bc0 = pNVar65;
                      local_1bb8.ptr = NVar61.ptr;
                      do {
                        lVar53 = lVar58 * 0x90;
                        uVar71 = *(ulong *)(NVar61.ptr + 0x20 + lVar53);
                        auVar80._8_8_ = 0;
                        auVar80._0_8_ = uVar71;
                        uVar21 = *(undefined8 *)(NVar61.ptr + 0x24 + lVar53);
                        bVar34 = (byte)uVar71;
                        bVar105 = (byte)uVar21;
                        bVar35 = (byte)(uVar71 >> 8);
                        bVar126 = (byte)((ulong)uVar21 >> 8);
                        bVar36 = (byte)(uVar71 >> 0x10);
                        bVar127 = (byte)((ulong)uVar21 >> 0x10);
                        bVar37 = (byte)(uVar71 >> 0x18);
                        bVar128 = (byte)((ulong)uVar21 >> 0x18);
                        bVar38 = (byte)(uVar71 >> 0x20);
                        bVar129 = (byte)((ulong)uVar21 >> 0x20);
                        bVar39 = (byte)(uVar71 >> 0x28);
                        bVar130 = (byte)((ulong)uVar21 >> 0x28);
                        bVar40 = (byte)(uVar71 >> 0x30);
                        bVar131 = (byte)((ulong)uVar21 >> 0x30);
                        bVar44 = (byte)((ulong)uVar21 >> 0x38);
                        bVar41 = (byte)(uVar71 >> 0x38);
                        auVar108[0] = -((byte)((bVar34 < bVar105) * bVar34 |
                                              (bVar34 >= bVar105) * bVar105) == bVar34);
                        auVar108[1] = -((byte)((bVar35 < bVar126) * bVar35 |
                                              (bVar35 >= bVar126) * bVar126) == bVar35);
                        auVar108[2] = -((byte)((bVar36 < bVar127) * bVar36 |
                                              (bVar36 >= bVar127) * bVar127) == bVar36);
                        auVar108[3] = -((byte)((bVar37 < bVar128) * bVar37 |
                                              (bVar37 >= bVar128) * bVar128) == bVar37);
                        auVar108[4] = -((byte)((bVar38 < bVar129) * bVar38 |
                                              (bVar38 >= bVar129) * bVar129) == bVar38);
                        auVar108[5] = -((byte)((bVar39 < bVar130) * bVar39 |
                                              (bVar39 >= bVar130) * bVar130) == bVar39);
                        auVar108[6] = -((byte)((bVar40 < bVar131) * bVar40 |
                                              (bVar40 >= bVar131) * bVar131) == bVar40);
                        auVar108[7] = -((byte)((bVar41 < bVar44) * bVar41 |
                                              (bVar41 >= bVar44) * bVar44) == bVar41);
                        auVar108[8] = 0xff;
                        auVar108[9] = 0xff;
                        auVar108[10] = 0xff;
                        auVar108[0xb] = 0xff;
                        auVar108[0xc] = 0xff;
                        auVar108[0xd] = 0xff;
                        auVar108[0xe] = 0xff;
                        auVar108[0xf] = 0xff;
                        auVar137._8_4_ = 0xffffffff;
                        auVar137._0_8_ = 0xffffffffffffffff;
                        auVar137._12_4_ = 0xffffffff;
                        auVar195 = pmovzxbd(auVar80,auVar108 ^ auVar137);
                        auVar195 = auVar195 ^ auVar137;
                        auVar81._0_4_ = auVar195._0_4_ << 0x1f;
                        auVar81._4_4_ = auVar195._4_4_ << 0x1f;
                        auVar81._8_4_ = auVar195._8_4_ << 0x1f;
                        auVar81._12_4_ = auVar195._12_4_ << 0x1f;
                        uVar243 = movmskps((int)pRVar60,auVar81);
                        pRVar60 = (RTCIntersectArguments *)(ulong)uVar243;
                        if (uVar243 != 0) {
                          lVar1 = NVar61.ptr + lVar53;
                          fVar162 = *(float *)(NVar61.ptr + 0x80 + lVar53);
                          fVar151 = *(float *)(NVar61.ptr + 0x84 + lVar53);
                          fVar133 = fVar151 * (*(float *)(ray + 0x70) - fVar162);
                          fVar148 = fVar151 * (*(float *)(ray + 0x74) - fVar162);
                          fVar104 = fVar151 * (*(float *)(ray + 0x78) - fVar162);
                          fVar151 = fVar151 * (*(float *)(ray + 0x7c) - fVar162);
                          valid_i = (vint<4> *)(ulong)(byte)uVar243;
                          do {
                            lVar53 = 0;
                            if ((Intersectors *)valid_i != (Intersectors *)0x0) {
                              for (; ((ulong)valid_i >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                              }
                            }
                            auVar82._8_8_ = 0;
                            auVar82._0_8_ = *(ulong *)(lVar1 + 0x20);
                            auVar195 = pmovzxbd(auVar82,auVar82);
                            fVar162 = *(float *)(lVar1 + 0x38);
                            fVar152 = *(float *)(lVar1 + 0x44);
                            hit.U.field_0.v[1] = (float)auVar195._4_4_ * fVar152 + fVar162;
                            hit.U.field_0.v[0] = (float)auVar195._0_4_ * fVar152 + fVar162;
                            hit.U.field_0.v[2] = (float)auVar195._8_4_ * fVar152 + fVar162;
                            hit.U.field_0.v[3] = (float)auVar195._12_4_ * fVar152 + fVar162;
                            fVar177 = hit.U.field_0.v[lVar53];
                            auVar83._8_8_ = 0;
                            auVar83._0_8_ = *(ulong *)(lVar1 + 0x50);
                            auVar195 = pmovzxbd(auVar83,auVar83);
                            fVar164 = *(float *)(lVar1 + 0x68);
                            fVar185 = *(float *)(lVar1 + 0x74);
                            local_19a8[0] = (float)auVar195._0_4_ * fVar185 + fVar164;
                            local_19a8[1] = (float)auVar195._4_4_ * fVar185 + fVar164;
                            local_19a8[2] = (float)auVar195._8_4_ * fVar185 + fVar164;
                            local_19a8[3] = (float)auVar195._12_4_ * fVar185 + fVar164;
                            fVar216 = local_19a8[lVar53] - fVar177;
                            auVar178._8_8_ = 0;
                            auVar178._0_8_ = *(ulong *)(lVar1 + 0x24);
                            auVar195 = pmovzxbd(auVar178,auVar178);
                            hit.U.field_0.v[1] = (float)auVar195._4_4_ * fVar152 + fVar162;
                            hit.U.field_0.v[0] = (float)auVar195._0_4_ * fVar152 + fVar162;
                            hit.U.field_0.v[2] = (float)auVar195._8_4_ * fVar152 + fVar162;
                            hit.U.field_0.v[3] = (float)auVar195._12_4_ * fVar152 + fVar162;
                            fVar162 = hit.U.field_0.v[lVar53];
                            auVar109._8_8_ = 0;
                            auVar109._0_8_ = *(ulong *)(lVar1 + 0x54);
                            auVar195 = pmovzxbd(auVar109,auVar109);
                            local_19a8[0] = (float)auVar195._0_4_ * fVar185 + fVar164;
                            local_19a8[1] = (float)auVar195._4_4_ * fVar185 + fVar164;
                            local_19a8[2] = (float)auVar195._8_4_ * fVar185 + fVar164;
                            local_19a8[3] = (float)auVar195._12_4_ * fVar185 + fVar164;
                            fVar106 = local_19a8[lVar53] - fVar162;
                            auVar138._8_8_ = 0;
                            auVar138._0_8_ = *(ulong *)(lVar1 + 0x28);
                            auVar195 = pmovzxbd(auVar138,auVar138);
                            fVar152 = *(float *)(lVar1 + 0x3c);
                            fVar164 = *(float *)(lVar1 + 0x48);
                            hit.U.field_0.v[1] = (float)auVar195._4_4_ * fVar164 + fVar152;
                            hit.U.field_0.v[0] = (float)auVar195._0_4_ * fVar164 + fVar152;
                            hit.U.field_0.v[2] = (float)auVar195._8_4_ * fVar164 + fVar152;
                            hit.U.field_0.v[3] = (float)auVar195._12_4_ * fVar164 + fVar152;
                            fVar185 = hit.U.field_0.v[lVar53];
                            auVar139._8_8_ = 0;
                            auVar139._0_8_ = *(ulong *)(lVar1 + 0x58);
                            auVar195 = pmovzxbd(auVar139,auVar139);
                            fVar165 = *(float *)(lVar1 + 0x6c);
                            fVar176 = *(float *)(lVar1 + 0x78);
                            local_19a8[0] = (float)auVar195._0_4_ * fVar176 + fVar165;
                            local_19a8[1] = (float)auVar195._4_4_ * fVar176 + fVar165;
                            local_19a8[2] = (float)auVar195._8_4_ * fVar176 + fVar165;
                            local_19a8[3] = (float)auVar195._12_4_ * fVar176 + fVar165;
                            fVar134 = local_19a8[lVar53] - fVar185;
                            auVar206._8_8_ = 0;
                            auVar206._0_8_ = *(ulong *)(lVar1 + 0x2c);
                            auVar195 = pmovzxbd(auVar206,auVar206);
                            hit.U.field_0.v[1] = (float)auVar195._4_4_ * fVar164 + fVar152;
                            hit.U.field_0.v[0] = (float)auVar195._0_4_ * fVar164 + fVar152;
                            hit.U.field_0.v[2] = (float)auVar195._8_4_ * fVar164 + fVar152;
                            hit.U.field_0.v[3] = (float)auVar195._12_4_ * fVar164 + fVar152;
                            fVar152 = hit.U.field_0.v[lVar53];
                            auVar154._8_8_ = 0;
                            auVar154._0_8_ = *(ulong *)(lVar1 + 0x5c);
                            auVar195 = pmovzxbd(auVar154,auVar154);
                            local_19a8[0] = (float)auVar195._0_4_ * fVar176 + fVar165;
                            local_19a8[1] = (float)auVar195._4_4_ * fVar176 + fVar165;
                            local_19a8[2] = (float)auVar195._8_4_ * fVar176 + fVar165;
                            local_19a8[3] = (float)auVar195._12_4_ * fVar176 + fVar165;
                            fVar74 = local_19a8[lVar53] - fVar152;
                            auVar166._8_8_ = 0;
                            auVar166._0_8_ = *(ulong *)(lVar1 + 0x30);
                            auVar195 = pmovzxbd(auVar166,auVar166);
                            fVar164 = *(float *)(lVar1 + 0x40);
                            fVar165 = *(float *)(lVar1 + 0x4c);
                            hit.U.field_0.v[1] = (float)auVar195._4_4_ * fVar165 + fVar164;
                            hit.U.field_0.v[0] = (float)auVar195._0_4_ * fVar165 + fVar164;
                            hit.U.field_0.v[2] = (float)auVar195._8_4_ * fVar165 + fVar164;
                            hit.U.field_0.v[3] = (float)auVar195._12_4_ * fVar165 + fVar164;
                            fVar176 = hit.U.field_0.v[lVar53];
                            auVar167._8_8_ = 0;
                            auVar167._0_8_ = *(ulong *)(lVar1 + 0x60);
                            auVar195 = pmovzxbd(auVar167,auVar167);
                            fVar188 = *(float *)(lVar1 + 0x70);
                            fVar191 = *(float *)(lVar1 + 0x7c);
                            local_19a8[0] = (float)auVar195._0_4_ * fVar191 + fVar188;
                            local_19a8[1] = (float)auVar195._4_4_ * fVar191 + fVar188;
                            local_19a8[2] = (float)auVar195._8_4_ * fVar191 + fVar188;
                            local_19a8[3] = (float)auVar195._12_4_ * fVar191 + fVar188;
                            fVar102 = local_19a8[lVar53] - fVar176;
                            auVar230._8_8_ = 0;
                            auVar230._0_8_ = *(ulong *)(lVar1 + 0x34);
                            auVar195 = pmovzxbd(auVar230,auVar230);
                            hit.U.field_0.v[1] = (float)auVar195._4_4_ * fVar165 + fVar164;
                            hit.U.field_0.v[0] = (float)auVar195._0_4_ * fVar165 + fVar164;
                            hit.U.field_0.v[2] = (float)auVar195._8_4_ * fVar165 + fVar164;
                            hit.U.field_0.v[3] = (float)auVar195._12_4_ * fVar165 + fVar164;
                            fVar164 = hit.U.field_0.v[lVar53];
                            auVar179._8_8_ = 0;
                            auVar179._0_8_ = *(ulong *)(lVar1 + 100);
                            auVar195 = pmovzxbd(auVar179,auVar179);
                            local_19a8[0] = (float)auVar195._0_4_ * fVar191 + fVar188;
                            local_19a8[1] = (float)auVar195._4_4_ * fVar191 + fVar188;
                            local_19a8[2] = (float)auVar195._8_4_ * fVar191 + fVar188;
                            local_19a8[3] = (float)auVar195._12_4_ * fVar191 + fVar188;
                            fVar165 = local_19a8[lVar53] - fVar164;
                            fVar188 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
                            fVar191 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
                            auVar84._0_8_ =
                                 CONCAT44(((fVar216 * fVar148 + fVar177) -
                                          (float)tray.org.field_0._4_4_) * tray.rdir.field_0._4_4_,
                                          ((fVar216 * fVar133 + fVar177) -
                                          (float)tray.org.field_0._0_4_) * tray.rdir.field_0._0_4_);
                            auVar84._8_4_ =
                                 ((fVar216 * fVar104 + fVar177) - (float)tray.org.field_0._8_4_) *
                                 tray.rdir.field_0._8_4_;
                            auVar84._12_4_ =
                                 ((fVar216 * fVar151 + fVar177) - (float)tray.org.field_0._12_4_) *
                                 tray.rdir.field_0._12_4_;
                            auVar140._0_8_ =
                                 CONCAT44(((fVar134 * fVar148 + fVar185) -
                                          (float)tray.org.field_0._20_4_) * tray.rdir.field_0._20_4_
                                          ,((fVar134 * fVar133 + fVar185) -
                                           (float)tray.org.field_0._16_4_) *
                                           tray.rdir.field_0._16_4_);
                            auVar140._8_4_ =
                                 ((fVar134 * fVar104 + fVar185) - (float)tray.org.field_0._24_4_) *
                                 tray.rdir.field_0._24_4_;
                            auVar140._12_4_ =
                                 ((fVar134 * fVar151 + fVar185) - (float)tray.org.field_0._28_4_) *
                                 tray.rdir.field_0._28_4_;
                            auVar168._0_8_ =
                                 CONCAT44(((fVar102 * fVar148 + fVar176) - fVar188) *
                                          tray.rdir.field_0._36_4_,
                                          ((fVar102 * fVar133 + fVar176) -
                                          (float)tray.org.field_0._32_8_) * tray.rdir.field_0._32_4_
                                         );
                            auVar168._8_4_ =
                                 ((fVar102 * fVar104 + fVar176) - (float)tray.org.field_0._40_8_) *
                                 tray.rdir.field_0._40_4_;
                            auVar168._12_4_ =
                                 ((fVar102 * fVar151 + fVar176) - fVar191) *
                                 tray.rdir.field_0._44_4_;
                            auVar110._0_4_ =
                                 ((fVar106 * fVar133 + fVar162) - (float)tray.org.field_0._0_4_) *
                                 tray.rdir.field_0._0_4_;
                            auVar110._4_4_ =
                                 ((fVar106 * fVar148 + fVar162) - (float)tray.org.field_0._4_4_) *
                                 tray.rdir.field_0._4_4_;
                            auVar110._8_4_ =
                                 ((fVar106 * fVar104 + fVar162) - (float)tray.org.field_0._8_4_) *
                                 tray.rdir.field_0._8_4_;
                            auVar110._12_4_ =
                                 ((fVar106 * fVar151 + fVar162) - (float)tray.org.field_0._12_4_) *
                                 tray.rdir.field_0._12_4_;
                            auVar155._0_4_ =
                                 ((fVar74 * fVar133 + fVar152) - (float)tray.org.field_0._16_4_) *
                                 tray.rdir.field_0._16_4_;
                            auVar155._4_4_ =
                                 ((fVar74 * fVar148 + fVar152) - (float)tray.org.field_0._20_4_) *
                                 tray.rdir.field_0._20_4_;
                            auVar155._8_4_ =
                                 ((fVar74 * fVar104 + fVar152) - (float)tray.org.field_0._24_4_) *
                                 tray.rdir.field_0._24_4_;
                            auVar155._12_4_ =
                                 ((fVar74 * fVar151 + fVar152) - (float)tray.org.field_0._28_4_) *
                                 tray.rdir.field_0._28_4_;
                            auVar180._0_4_ =
                                 ((fVar165 * fVar133 + fVar164) - (float)tray.org.field_0._32_8_) *
                                 tray.rdir.field_0._32_4_;
                            auVar180._4_4_ =
                                 ((fVar165 * fVar148 + fVar164) - fVar188) *
                                 tray.rdir.field_0._36_4_;
                            auVar180._8_4_ =
                                 ((fVar165 * fVar104 + fVar164) - (float)tray.org.field_0._40_8_) *
                                 tray.rdir.field_0._40_4_;
                            auVar180._12_4_ =
                                 ((fVar165 * fVar151 + fVar164) - fVar191) *
                                 tray.rdir.field_0._44_4_;
                            auVar196._8_4_ = auVar84._8_4_;
                            auVar196._0_8_ = auVar84._0_8_;
                            auVar196._12_4_ = auVar84._12_4_;
                            auVar195 = minps(auVar196,auVar110);
                            auVar207._8_4_ = auVar140._8_4_;
                            auVar207._0_8_ = auVar140._0_8_;
                            auVar207._12_4_ = auVar140._12_4_;
                            auVar208 = minps(auVar207,auVar155);
                            auVar195 = maxps(auVar195,auVar208);
                            auVar209._8_4_ = auVar168._8_4_;
                            auVar209._0_8_ = auVar168._0_8_;
                            auVar209._12_4_ = auVar168._12_4_;
                            auVar208 = minps(auVar209,auVar180);
                            auVar195 = maxps(auVar195,auVar208);
                            auVar197._0_4_ = auVar195._0_4_ * 0.99999964;
                            auVar197._4_4_ = auVar195._4_4_ * 0.99999964;
                            auVar197._8_4_ = auVar195._8_4_ * 0.99999964;
                            auVar197._12_4_ = auVar195._12_4_ * 0.99999964;
                            auVar195 = maxps(auVar84,auVar110);
                            auVar208 = maxps(auVar140,auVar155);
                            auVar195 = minps(auVar195,auVar208);
                            auVar208 = maxps(auVar168,auVar180);
                            auVar195 = minps(auVar195,auVar208);
                            auVar85._0_4_ = auVar195._0_4_ * 1.0000004;
                            auVar85._4_4_ = auVar195._4_4_ * 1.0000004;
                            auVar85._8_4_ = auVar195._8_4_ * 1.0000004;
                            auVar85._12_4_ = auVar195._12_4_ * 1.0000004;
                            auVar208 = maxps(auVar197,(undefined1  [16])tray.tnear.field_0);
                            auVar195 = minps(auVar85,(undefined1  [16])tray.tfar.field_0);
                            auVar198._0_4_ =
                                 -(uint)(auVar208._0_4_ <= auVar195._0_4_) & aVar266.i[0];
                            uVar246 = aVar266.i[1];
                            auVar198._4_4_ = -(uint)(auVar208._4_4_ <= auVar195._4_4_) & uVar246;
                            uVar249 = aVar266.i[2];
                            auVar198._8_4_ = -(uint)(auVar208._8_4_ <= auVar195._8_4_) & uVar249;
                            uVar223 = aVar266.i[3];
                            auVar198._12_4_ = -(uint)(auVar208._12_4_ <= auVar195._12_4_) & uVar223;
                            uVar243 = movmskps((int)pRVar60,auVar198);
                            pRVar60 = (RTCIntersectArguments *)(ulong)uVar243;
                            if (uVar243 == 0) {
                              bVar73 = false;
                            }
                            else {
                              uVar22 = *(ushort *)(lVar1 + lVar53 * 8);
                              pRVar60 = (RTCIntersectArguments *)(ulong)uVar22;
                              uVar23 = *(ushort *)(lVar1 + 2 + lVar53 * 8);
                              uVar243 = *(uint *)(lVar1 + 0x88);
                              uVar226 = *(uint *)(lVar1 + 4 + lVar53 * 8);
                              valid0.field_0 = aVar266;
                              uVar228 = movmskps(uVar226,(undefined1  [16])aVar266);
                              uVar71 = (ulong)uVar228;
                              if (uVar228 != 0) {
                                uVar51 = (ulong)(byte)uVar228;
                                local_1b9c = uVar22 & 0x7fff;
                                local_1ba0 = uVar23 & 0x7fff;
                                local_18e8 = (float)local_1b9c;
                                fStack_18e4 = (float)(local_1b9c + 1);
                                fStack_18e0 = (float)(local_1b9c + 1);
                                fStack_18dc = (float)local_1b9c;
                                local_18f8 = (float)local_1ba0;
                                fStack_18f4 = (float)local_1ba0;
                                fStack_18f0 = (float)(local_1ba0 + 1);
                                fStack_18ec = (float)(local_1ba0 + 1);
                                local_1908 = uVar243;
                                uStack_1904 = uVar243;
                                uStack_1900 = uVar243;
                                uStack_18fc = uVar243;
                                local_1918 = uVar226;
                                uStack_1914 = uVar226;
                                uStack_1910 = uVar226;
                                uStack_190c = uVar226;
                                do {
                                  aVar145 = _local_1be8;
                                  lVar53 = 0;
                                  if (uVar51 != 0) {
                                    for (; (uVar51 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                                    }
                                  }
                                  pGVar24 = (context->scene->geometries).items[uVar243].ptr;
                                  lVar62 = *(long *)&pGVar24->field_0x58;
                                  lVar54 = pGVar24[1].super_RefCount.refCounter.
                                           super___atomic_base<unsigned_long>._M_i * (ulong)uVar226;
                                  fVar252 = pGVar24->fnumTimeSegments;
                                  fVar257 = (pGVar24->time_range).lower;
                                  auVar141._0_4_ = (pGVar24->time_range).upper - fVar257;
                                  auVar111._4_4_ = fVar257;
                                  auVar111._0_4_ = fVar257;
                                  auVar111._8_4_ = fVar257;
                                  auVar111._12_4_ = fVar257;
                                  auVar169._0_4_ = *(float *)(ray + 0x70) - fVar257;
                                  auVar169._4_4_ = *(float *)(ray + 0x74) - fVar257;
                                  auVar169._8_4_ = *(float *)(ray + 0x78) - fVar257;
                                  auVar169._12_4_ = *(float *)(ray + 0x7c) - fVar257;
                                  auVar141._4_4_ = auVar141._0_4_;
                                  auVar141._8_4_ = auVar141._0_4_;
                                  auVar141._12_4_ = auVar141._0_4_;
                                  auVar195 = divps(auVar169,auVar141);
                                  auVar170._0_4_ = auVar195._0_4_ * fVar252;
                                  auVar170._4_4_ = auVar195._4_4_ * fVar252;
                                  auVar170._8_4_ = auVar195._8_4_ * fVar252;
                                  auVar170._12_4_ = auVar195._12_4_ * fVar252;
                                  auVar195 = roundps(auVar111,auVar170,1);
                                  auVar86._0_4_ = fVar252 + -1.0;
                                  auVar86._4_4_ = auVar86._0_4_;
                                  auVar86._8_4_ = auVar86._0_4_;
                                  auVar86._12_4_ = auVar86._0_4_;
                                  auVar195 = minps(auVar195,auVar86);
                                  auVar195 = maxps(auVar195,_DAT_01feba10);
                                  ftime.field_0.v[0] = auVar170._0_4_ - auVar195._0_4_;
                                  ftime.field_0.v[1] = auVar170._4_4_ - auVar195._4_4_;
                                  ftime.field_0.v[2] = auVar170._8_4_ - auVar195._8_4_;
                                  ftime.field_0.v[3] = auVar170._12_4_ - auVar195._12_4_;
                                  itime.field_0.i[0] = (int)auVar195._0_4_;
                                  itime.field_0.i[1] = (int)auVar195._4_4_;
                                  itime.field_0.i[2] = (int)auVar195._8_4_;
                                  itime.field_0.i[3] = (int)auVar195._12_4_;
                                  uVar228 = *(uint *)(lVar62 + 4 + lVar54);
                                  uVar68 = (ulong)uVar228;
                                  uVar64 = (ulong)(uVar228 * local_1ba0 +
                                                  *(int *)(lVar62 + lVar54) + local_1b9c);
                                  lVar25 = *(long *)&pGVar24[2].numPrimitives;
                                  lVar63 = (long)itime.field_0.i[lVar53] * 0x38;
                                  lVar26 = *(long *)(lVar25 + lVar63);
                                  lVar27 = *(long *)(lVar25 + 0x10 + lVar63);
                                  pRVar60 = *(RTCIntersectArguments **)(lVar25 + 0x48 + lVar63);
                                  lVar69 = (long)pRVar60 * (uVar64 + 1);
                                  lVar56 = uVar64 + uVar68;
                                  pfVar2 = (float *)(lVar26 + lVar27 * uVar64);
                                  lVar70 = uVar64 + uVar68 + 1;
                                  pfVar3 = (float *)(lVar26 + (uVar64 + 1) * lVar27);
                                  pfVar4 = (float *)(lVar26 + lVar56 * lVar27);
                                  pfVar5 = (float *)(lVar26 + lVar70 * lVar27);
                                  lVar55 = uVar64 + (-1 < (short)uVar22) + 1;
                                  pfVar6 = (float *)(lVar26 + lVar55 * lVar27);
                                  lVar7 = lVar70 + (ulong)(-1 < (short)uVar22);
                                  pfVar8 = (float *)(lVar26 + lVar7 * lVar27);
                                  uVar71 = 0;
                                  if (-1 < (short)uVar23) {
                                    uVar71 = uVar68;
                                  }
                                  pfVar9 = (float *)(lVar26 + (lVar56 + uVar71) * lVar27);
                                  pfVar10 = (float *)(lVar26 + (lVar70 + uVar71) * lVar27);
                                  puVar11 = (undefined8 *)(lVar26 + lVar27 * (uVar71 + lVar7));
                                  uVar21 = *puVar11;
                                  uVar45 = puVar11[1];
                                  lVar25 = *(long *)(lVar25 + 0x38 + lVar63);
                                  pfVar12 = (float *)(lVar25 + (long)pRVar60 * uVar64);
                                  pfVar13 = (float *)(lVar25 + lVar69);
                                  pfVar14 = (float *)(lVar25 + (long)pRVar60 * lVar56);
                                  pfVar15 = (float *)(lVar25 + (long)pRVar60 * lVar70);
                                  pfVar16 = (float *)(lVar25 + (long)pRVar60 * lVar55);
                                  pfVar17 = (float *)(lVar25 + (long)pRVar60 * lVar7);
                                  fVar252 = *(float *)((long)&stack_node[-2].ptr + lVar53 * 4);
                                  pfVar18 = (float *)(lVar25 + (long)pRVar60 * (lVar56 + uVar71));
                                  fVar286 = (*pfVar13 - *pfVar3) * fVar252 + *pfVar3;
                                  fVar194 = (pfVar13[1] - pfVar3[1]) * fVar252 + pfVar3[1];
                                  fVar289 = (pfVar13[2] - pfVar3[2]) * fVar252 + pfVar3[2];
                                  pfVar3 = (float *)(lVar25 + (long)pRVar60 * (lVar70 + uVar71));
                                  local_1be8._0_4_ = (*pfVar14 - *pfVar4) * fVar252 + *pfVar4;
                                  fVar270 = (pfVar14[1] - pfVar4[1]) * fVar252 + pfVar4[1];
                                  fVar175 = (pfVar14[2] - pfVar4[2]) * fVar252 + pfVar4[2];
                                  puVar11 = (undefined8 *)
                                            (lVar25 + (uVar71 + lVar7) * (long)pRVar60);
                                  uVar46 = *puVar11;
                                  uVar47 = puVar11[1];
                                  local_1be8._4_4_ = (*pfVar15 - *pfVar5) * fVar252 + *pfVar5;
                                  fVar214 = (pfVar15[1] - pfVar5[1]) * fVar252 + pfVar5[1];
                                  fVar247 = (pfVar15[2] - pfVar5[2]) * fVar252 + pfVar5[2];
                                  fVar218 = (*pfVar16 - *pfVar6) * fVar252 + *pfVar6;
                                  fVar202 = (pfVar16[1] - pfVar6[1]) * fVar252 + pfVar6[1];
                                  fVar224 = (pfVar16[2] - pfVar6[2]) * fVar252 + pfVar6[2];
                                  fVar274 = (*pfVar17 - *pfVar8) * fVar252 + *pfVar8;
                                  fVar204 = (pfVar17[1] - pfVar8[1]) * fVar252 + pfVar8[1];
                                  fVar281 = (pfVar17[2] - pfVar8[2]) * fVar252 + pfVar8[2];
                                  fVar152 = (*pfVar18 - *pfVar9) * fVar252 + *pfVar9;
                                  fVar164 = (pfVar18[1] - pfVar9[1]) * fVar252 + pfVar9[1];
                                  fVar292 = (*pfVar3 - *pfVar10) * fVar252 + *pfVar10;
                                  fVar295 = (pfVar3[1] - pfVar10[1]) * fVar252 + pfVar10[1];
                                  fVar163 = (pfVar3[2] - pfVar10[2]) * fVar252 + pfVar10[2];
                                  hit.mapUV = &mapUV;
                                  fVar257 = *(float *)(ray + lVar53 * 4);
                                  fVar205 = ((*pfVar12 - *pfVar2) * fVar252 + *pfVar2) - fVar257;
                                  fVar213 = fVar286 - fVar257;
                                  fVar215 = (float)local_1be8._4_4_ - fVar257;
                                  fVar217 = (float)local_1be8._0_4_ - fVar257;
                                  fVar74 = fVar286 - fVar257;
                                  fVar103 = fVar218 - fVar257;
                                  fVar147 = fVar274 - fVar257;
                                  fVar150 = (float)local_1be8._4_4_ - fVar257;
                                  _fStack_1be0 = aVar145._8_8_;
                                  local_1bd8._4_4_ = fVar152;
                                  local_1bd8._0_4_ = fVar292;
                                  fVar177 = (float)local_1be8._0_4_ - fVar257;
                                  fVar185 = (float)local_1be8._4_4_ - fVar257;
                                  fVar165 = fVar292 - fVar257;
                                  fVar152 = fVar152 - fVar257;
                                  fVar257 = *(float *)(ray + lVar53 * 4 + 0x10);
                                  fVar229 = ((pfVar12[1] - pfVar2[1]) * fVar252 + pfVar2[1]) -
                                            fVar257;
                                  fVar233 = fVar194 - fVar257;
                                  fVar235 = fVar214 - fVar257;
                                  fVar237 = fVar270 - fVar257;
                                  fVar293 = fVar194 - fVar257;
                                  fVar296 = fVar202 - fVar257;
                                  fVar298 = fVar204 - fVar257;
                                  fVar300 = fVar214 - fVar257;
                                  fVar176 = fVar270 - fVar257;
                                  fVar188 = fVar214 - fVar257;
                                  fVar191 = fVar295 - fVar257;
                                  fVar257 = fVar164 - fVar257;
                                  fVar259 = *(float *)(ray + lVar53 * 4 + 0x20);
                                  fVar174 = ((pfVar12[2] - pfVar2[2]) * fVar252 + pfVar2[2]) -
                                            fVar259;
                                  fVar201 = fVar289 - fVar259;
                                  fVar203 = fVar247 - fVar259;
                                  fVar212 = fVar175 - fVar259;
                                  fVar287 = fVar289 - fVar259;
                                  fVar288 = fVar224 - fVar259;
                                  fVar290 = fVar281 - fVar259;
                                  fVar291 = fVar247 - fVar259;
                                  fVar216 = fVar175 - fVar259;
                                  fVar106 = fVar247 - fVar259;
                                  fVar134 = fVar163 - fVar259;
                                  fVar259 = ((pfVar18[2] - pfVar9[2]) * fVar252 + pfVar9[2]) -
                                            fVar259;
                                  fVar244 = fVar177 - fVar205;
                                  fVar186 = fVar185 - fVar213;
                                  fVar189 = fVar165 - fVar215;
                                  fVar192 = fVar152 - fVar217;
                                  fVar275 = fVar176 - fVar229;
                                  fVar279 = fVar188 - fVar233;
                                  fVar282 = fVar191 - fVar235;
                                  fVar284 = fVar257 - fVar237;
                                  fVar239 = fVar216 - fVar174;
                                  fVar245 = fVar106 - fVar201;
                                  fVar248 = fVar134 - fVar203;
                                  fVar251 = fVar259 - fVar212;
                                  fStack_1b94 = *(float *)(ray + lVar53 * 4 + 0x50);
                                  fVar261 = *(float *)(ray + lVar53 * 4 + 0x60);
                                  fVar162 = *(float *)(ray + lVar53 * 4 + 0x40);
                                  fVar264 = (fVar275 * (fVar216 + fVar174) -
                                            (fVar176 + fVar229) * fVar239) * fVar162 +
                                            ((fVar177 + fVar205) * fVar239 -
                                            (fVar216 + fVar174) * fVar244) * fStack_1b94 +
                                            (fVar244 * (fVar176 + fVar229) -
                                            (fVar177 + fVar205) * fVar275) * fVar261;
                                  fVar271 = (fVar279 * (fVar106 + fVar201) -
                                            (fVar188 + fVar233) * fVar245) * fVar162 +
                                            ((fVar185 + fVar213) * fVar245 -
                                            (fVar106 + fVar201) * fVar186) * fStack_1b94 +
                                            (fVar186 * (fVar188 + fVar233) -
                                            (fVar185 + fVar213) * fVar279) * fVar261;
                                  fVar272 = (fVar282 * (fVar134 + fVar203) -
                                            (fVar191 + fVar235) * fVar248) * fVar162 +
                                            ((fVar165 + fVar215) * fVar248 -
                                            (fVar134 + fVar203) * fVar189) * fStack_1b94 +
                                            (fVar189 * (fVar191 + fVar235) -
                                            (fVar165 + fVar215) * fVar282) * fVar261;
                                  fVar273 = (fVar284 * (fVar259 + fVar212) -
                                            (fVar257 + fVar237) * fVar251) * fVar162 +
                                            ((fVar152 + fVar217) * fVar251 -
                                            (fVar259 + fVar212) * fVar192) * fStack_1b94 +
                                            (fVar192 * (fVar257 + fVar237) -
                                            (fVar152 + fVar217) * fVar284) * fVar261;
                                  fVar250 = fVar205 - fVar74;
                                  fVar187 = fVar213 - fVar103;
                                  fVar190 = fVar215 - fVar147;
                                  fVar193 = fVar217 - fVar150;
                                  fVar253 = fVar229 - fVar293;
                                  fVar258 = fVar233 - fVar296;
                                  fVar260 = fVar235 - fVar298;
                                  fVar262 = fVar237 - fVar300;
                                  fVar102 = fVar174 - fVar287;
                                  fVar132 = fVar201 - fVar288;
                                  fVar149 = fVar203 - fVar290;
                                  fVar161 = fVar212 - fVar291;
                                  auVar156._0_4_ =
                                       (fVar253 * (fVar174 + fVar287) -
                                       (fVar229 + fVar293) * fVar102) * fVar162 +
                                       ((fVar205 + fVar74) * fVar102 - (fVar174 + fVar287) * fVar250
                                       ) * fStack_1b94 +
                                       (fVar250 * (fVar229 + fVar293) - (fVar205 + fVar74) * fVar253
                                       ) * fVar261;
                                  auVar156._4_4_ =
                                       (fVar258 * (fVar201 + fVar288) -
                                       (fVar233 + fVar296) * fVar132) * fVar162 +
                                       ((fVar213 + fVar103) * fVar132 -
                                       (fVar201 + fVar288) * fVar187) * fStack_1b94 +
                                       (fVar187 * (fVar233 + fVar296) -
                                       (fVar213 + fVar103) * fVar258) * fVar261;
                                  auVar156._8_4_ =
                                       (fVar260 * (fVar203 + fVar290) -
                                       (fVar235 + fVar298) * fVar149) * fVar162 +
                                       ((fVar215 + fVar147) * fVar149 -
                                       (fVar203 + fVar290) * fVar190) * fStack_1b94 +
                                       (fVar190 * (fVar235 + fVar298) -
                                       (fVar215 + fVar147) * fVar260) * fVar261;
                                  auVar156._12_4_ =
                                       (fVar262 * (fVar212 + fVar291) -
                                       (fVar237 + fVar300) * fVar161) * fVar162 +
                                       ((fVar217 + fVar150) * fVar161 -
                                       (fVar212 + fVar291) * fVar193) * fStack_1b94 +
                                       (fVar193 * (fVar237 + fVar300) -
                                       (fVar217 + fVar150) * fVar262) * fVar261;
                                  fVar276 = fVar74 - fVar177;
                                  fVar280 = fVar103 - fVar185;
                                  fVar283 = fVar147 - fVar165;
                                  fVar285 = fVar150 - fVar152;
                                  fVar294 = fVar293 - fVar176;
                                  fVar297 = fVar296 - fVar188;
                                  fVar299 = fVar298 - fVar191;
                                  fVar301 = fVar300 - fVar257;
                                  fVar219 = fVar287 - fVar216;
                                  fVar222 = fVar288 - fVar106;
                                  fVar225 = fVar290 - fVar134;
                                  fVar227 = fVar291 - fVar259;
                                  fVar177 = (fVar294 * (fVar216 + fVar287) -
                                            (fVar176 + fVar293) * fVar219) * fVar162 +
                                            ((fVar177 + fVar74) * fVar219 -
                                            (fVar216 + fVar287) * fVar276) * fStack_1b94 +
                                            (fVar276 * (fVar176 + fVar293) -
                                            (fVar177 + fVar74) * fVar294) * fVar261;
                                  fVar216 = (fVar297 * (fVar106 + fVar288) -
                                            (fVar188 + fVar296) * fVar222) * fVar162 +
                                            ((fVar185 + fVar103) * fVar222 -
                                            (fVar106 + fVar288) * fVar280) * fStack_1b94 +
                                            (fVar280 * (fVar188 + fVar296) -
                                            (fVar185 + fVar103) * fVar297) * fVar261;
                                  fVar191 = (fVar299 * (fVar134 + fVar290) -
                                            (fVar191 + fVar298) * fVar225) * fVar162 +
                                            ((fVar165 + fVar147) * fVar225 -
                                            (fVar134 + fVar290) * fVar283) * fStack_1b94 +
                                            (fVar283 * (fVar191 + fVar298) -
                                            (fVar165 + fVar147) * fVar299) * fVar261;
                                  fVar257 = (fVar301 * (fVar259 + fVar291) -
                                            (fVar257 + fVar300) * fVar227) * fVar162 +
                                            ((fVar152 + fVar150) * fVar227 -
                                            (fVar259 + fVar291) * fVar285) * fStack_1b94 +
                                            (fVar285 * (fVar257 + fVar300) -
                                            (fVar152 + fVar150) * fVar301) * fVar261;
                                  fVar185 = fVar264 + auVar156._0_4_ + fVar177;
                                  fVar165 = fVar271 + auVar156._4_4_ + fVar216;
                                  fVar176 = fVar272 + auVar156._8_4_ + fVar191;
                                  fVar188 = fVar273 + auVar156._12_4_ + fVar257;
                                  auVar87._8_4_ = fVar272;
                                  auVar87._0_8_ = CONCAT44(fVar271,fVar264);
                                  auVar87._12_4_ = fVar273;
                                  auVar195 = minps(auVar87,auVar156);
                                  auVar42._4_4_ = fVar216;
                                  auVar42._0_4_ = fVar177;
                                  auVar42._8_4_ = fVar191;
                                  auVar42._12_4_ = fVar257;
                                  auVar195 = minps(auVar195,auVar42);
                                  auVar254._8_4_ = fVar272;
                                  auVar254._0_8_ = CONCAT44(fVar271,fVar264);
                                  auVar254._12_4_ = fVar273;
                                  auVar208 = maxps(auVar254,auVar156);
                                  auVar43._4_4_ = fVar216;
                                  auVar43._0_4_ = fVar177;
                                  auVar43._8_4_ = fVar191;
                                  auVar43._12_4_ = fVar257;
                                  auVar208 = maxps(auVar208,auVar43);
                                  fVar257 = ABS(fVar185) * 1.1920929e-07;
                                  fVar259 = ABS(fVar165) * 1.1920929e-07;
                                  fVar152 = ABS(fVar176) * 1.1920929e-07;
                                  fVar177 = ABS(fVar188) * 1.1920929e-07;
                                  auVar255._4_4_ = -(uint)(auVar208._4_4_ <= fVar259);
                                  auVar255._0_4_ = -(uint)(auVar208._0_4_ <= fVar257);
                                  auVar255._8_4_ = -(uint)(auVar208._8_4_ <= fVar152);
                                  auVar255._12_4_ = -(uint)(auVar208._12_4_ <= fVar177);
                                  auVar88._4_4_ = -(uint)(-fVar259 <= auVar195._4_4_);
                                  auVar88._0_4_ = -(uint)(-fVar257 <= auVar195._0_4_);
                                  auVar88._8_4_ = -(uint)(-fVar152 <= auVar195._8_4_);
                                  auVar88._12_4_ = -(uint)(-fVar177 <= auVar195._12_4_);
                                  auVar255 = auVar255 | auVar88;
                                  uVar228 = movmskps((int)((long)pRVar60 * lVar7),auVar255);
                                  pRVar57 = (RTCIntersectArguments *)(ulong)uVar228;
                                  local_1bb0 = lVar54;
                                  local_1ba8 = lVar62;
                                  if (uVar228 == 0) {
LAB_0025daa2:
                                    local_1778 = (float)uVar21;
                                    fStack_1774 = (float)((ulong)uVar21 >> 0x20);
                                    fStack_1770 = (float)uVar45;
                                    local_17a8 = (float)uVar46;
                                    fStack_17a4 = (float)((ulong)uVar46 >> 0x20);
                                    fStack_17a0 = (float)uVar47;
                                    fVar257 = *(float *)(ray + lVar53 * 4);
                                    fVar259 = *(float *)(ray + lVar53 * 4 + 0x10);
                                    fVar261 = *(float *)(ray + lVar53 * 4 + 0x20);
                                    fVar219 = (float)local_1be8._4_4_ - fVar257;
                                    fVar274 = fVar274 - fVar257;
                                    fVar227 = (fVar252 * (local_17a8 - local_1778) + local_1778) -
                                              fVar257;
                                    fVar292 = fVar292 - fVar257;
                                    fVar188 = fVar214 - fVar259;
                                    fVar191 = fVar204 - fVar259;
                                    fVar216 = (fVar252 * (fStack_17a4 - fStack_1774) + fStack_1774)
                                              - fVar259;
                                    fVar106 = fVar295 - fVar259;
                                    fVar177 = fVar247 - fVar261;
                                    fVar185 = fVar281 - fVar261;
                                    fVar165 = (fVar252 * (fStack_17a0 - fStack_1770) + fStack_1770)
                                              - fVar261;
                                    fVar163 = fVar163 - fVar261;
                                    fStack_1be0 = aVar145.v[2];
                                    fStack_1bdc = aVar145.v[3];
                                    local_1be8._0_4_ = (float)local_1be8._0_4_ - fVar257;
                                    local_1be8._4_4_ = (float)local_1be8._4_4_ - fVar257;
                                    fStack_1be0 = fStack_1be0 - fVar257;
                                    fStack_1bdc = fStack_1bdc - fVar257;
                                    fVar270 = fVar270 - fVar259;
                                    fVar201 = fVar214 - fVar259;
                                    fVar295 = fVar295 - fVar259;
                                    fVar164 = fVar164 - fVar259;
                                    fVar175 = fVar175 - fVar261;
                                    fVar162 = fVar247 - fVar261;
                                    fVar152 = fStack_1c30 - fVar261;
                                    fVar176 = fStack_1c2c - fVar261;
                                    fVar286 = fVar286 - fVar257;
                                    fVar218 = fVar218 - fVar257;
                                    fVar260 = fStack_1740 - fVar257;
                                    fVar257 = fStack_173c - fVar257;
                                    fVar194 = fVar194 - fVar259;
                                    fVar202 = fVar202 - fVar259;
                                    fVar204 = fVar204 - fVar259;
                                    fVar214 = fVar214 - fVar259;
                                    fVar289 = fVar289 - fVar261;
                                    fVar224 = fVar224 - fVar261;
                                    fVar281 = fVar281 - fVar261;
                                    fVar247 = fVar247 - fVar261;
                                    local_1b98 = fVar286 - fVar219;
                                    fStack_1b94 = fVar218 - fVar274;
                                    fStack_1b90 = fVar260 - fVar227;
                                    fStack_1b8c = fVar257 - fVar292;
                                    fVar235 = fVar194 - fVar188;
                                    fVar239 = fVar202 - fVar191;
                                    fVar248 = fVar204 - fVar216;
                                    fVar253 = fVar214 - fVar106;
                                    fVar134 = fVar289 - fVar177;
                                    fVar102 = fVar224 - fVar185;
                                    fVar132 = fVar281 - fVar165;
                                    fVar149 = fVar247 - fVar163;
                                    fStack_1c30 = *(float *)(ray + lVar53 * 4 + 0x50);
                                    fVar252 = *(float *)(ray + lVar53 * 4 + 0x60);
                                    fVar259 = *(float *)(ray + lVar53 * 4 + 0x40);
                                    fVar189 = (fVar235 * (fVar289 + fVar177) -
                                              (fVar194 + fVar188) * fVar134) * fVar259 +
                                              ((fVar286 + fVar219) * fVar134 -
                                              (fVar289 + fVar177) * local_1b98) * fStack_1c30 +
                                              (local_1b98 * (fVar194 + fVar188) -
                                              (fVar286 + fVar219) * fVar235) * fVar252;
                                    fVar192 = (fVar239 * (fVar224 + fVar185) -
                                              (fVar202 + fVar191) * fVar102) * fVar259 +
                                              ((fVar218 + fVar274) * fVar102 -
                                              (fVar224 + fVar185) * fStack_1b94) * fStack_1c30 +
                                              (fStack_1b94 * (fVar202 + fVar191) -
                                              (fVar218 + fVar274) * fVar239) * fVar252;
                                    fVar205 = (fVar248 * (fVar281 + fVar165) -
                                              (fVar204 + fVar216) * fVar132) * fVar259 +
                                              ((fVar260 + fVar227) * fVar132 -
                                              (fVar281 + fVar165) * fStack_1b90) * fStack_1c30 +
                                              (fStack_1b90 * (fVar204 + fVar216) -
                                              (fVar260 + fVar227) * fVar248) * fVar252;
                                    fVar215 = (fVar253 * (fVar247 + fVar163) -
                                              (fVar214 + fVar106) * fVar149) * fVar259 +
                                              ((fVar257 + fVar292) * fVar149 -
                                              (fVar247 + fVar163) * fStack_1b8c) * fStack_1c30 +
                                              (fStack_1b8c * (fVar214 + fVar106) -
                                              (fVar257 + fVar292) * fVar253) * fVar252;
                                    fVar237 = fVar219 - (float)local_1be8._0_4_;
                                    fVar245 = fVar274 - (float)local_1be8._4_4_;
                                    fVar251 = fVar227 - fStack_1be0;
                                    fVar258 = fVar292 - fStack_1bdc;
                                    fVar74 = fVar188 - fVar270;
                                    fVar103 = fVar191 - fVar201;
                                    fVar147 = fVar216 - fVar295;
                                    fVar150 = fVar106 - fVar164;
                                    fVar161 = fVar177 - fVar175;
                                    fVar203 = fVar185 - fVar162;
                                    fVar244 = fVar165 - fVar152;
                                    fVar186 = fVar163 - fVar176;
                                    auVar210._0_4_ =
                                         (fVar74 * (fVar177 + fVar175) -
                                         (fVar188 + fVar270) * fVar161) * fVar259 +
                                         ((fVar219 + (float)local_1be8._0_4_) * fVar161 -
                                         (fVar177 + fVar175) * fVar237) * fStack_1c30 +
                                         (fVar237 * (fVar188 + fVar270) -
                                         (fVar219 + (float)local_1be8._0_4_) * fVar74) * fVar252;
                                    auVar210._4_4_ =
                                         (fVar103 * (fVar185 + fVar162) -
                                         (fVar191 + fVar201) * fVar203) * fVar259 +
                                         ((fVar274 + (float)local_1be8._4_4_) * fVar203 -
                                         (fVar185 + fVar162) * fVar245) * fStack_1c30 +
                                         (fVar245 * (fVar191 + fVar201) -
                                         (fVar274 + (float)local_1be8._4_4_) * fVar103) * fVar252;
                                    auVar210._8_4_ =
                                         (fVar147 * (fVar165 + fVar152) -
                                         (fVar216 + fVar295) * fVar244) * fVar259 +
                                         ((fVar227 + fStack_1be0) * fVar244 -
                                         (fVar165 + fVar152) * fVar251) * fStack_1c30 +
                                         (fVar251 * (fVar216 + fVar295) -
                                         (fVar227 + fStack_1be0) * fVar147) * fVar252;
                                    auVar210._12_4_ =
                                         (fVar150 * (fVar163 + fVar176) -
                                         (fVar106 + fVar164) * fVar186) * fVar259 +
                                         ((fVar292 + fStack_1bdc) * fVar186 -
                                         (fVar163 + fVar176) * fVar258) * fStack_1c30 +
                                         (fVar258 * (fVar106 + fVar164) -
                                         (fVar292 + fStack_1bdc) * fVar150) * fVar252;
                                    fVar222 = (float)local_1be8._0_4_ - fVar286;
                                    fVar225 = (float)local_1be8._4_4_ - fVar218;
                                    fVar229 = fStack_1be0 - fVar260;
                                    fVar233 = fStack_1bdc - fVar257;
                                    auVar182._8_4_ = fVar205;
                                    auVar182._0_8_ = CONCAT44(fVar192,fVar189);
                                    auVar182._12_4_ = fVar215;
                                    fVar190 = fVar270 - fVar194;
                                    fVar193 = fVar201 - fVar202;
                                    fVar213 = fVar295 - fVar204;
                                    fVar217 = fVar164 - fVar214;
                                    fVar174 = fVar175 - fVar289;
                                    fVar212 = fVar162 - fVar224;
                                    fVar250 = fVar152 - fVar281;
                                    fVar187 = fVar176 - fVar247;
                                    auVar94._0_4_ =
                                         (fVar190 * (fVar289 + fVar175) -
                                         (fVar194 + fVar270) * fVar174) * fVar259 +
                                         ((fVar286 + (float)local_1be8._0_4_) * fVar174 -
                                         (fVar289 + fVar175) * fVar222) * fStack_1c30 +
                                         (fVar222 * (fVar194 + fVar270) -
                                         (fVar286 + (float)local_1be8._0_4_) * fVar190) * fVar252;
                                    auVar94._4_4_ =
                                         (fVar193 * (fVar224 + fVar162) -
                                         (fVar202 + fVar201) * fVar212) * fVar259 +
                                         ((fVar218 + (float)local_1be8._4_4_) * fVar212 -
                                         (fVar224 + fVar162) * fVar225) * fStack_1c30 +
                                         (fVar225 * (fVar202 + fVar201) -
                                         (fVar218 + (float)local_1be8._4_4_) * fVar193) * fVar252;
                                    auVar94._8_4_ =
                                         (fVar213 * (fVar281 + fVar152) -
                                         (fVar204 + fVar295) * fVar250) * fVar259 +
                                         ((fVar260 + fStack_1be0) * fVar250 -
                                         (fVar281 + fVar152) * fVar229) * fStack_1c30 +
                                         (fVar229 * (fVar204 + fVar295) -
                                         (fVar260 + fStack_1be0) * fVar213) * fVar252;
                                    auVar94._12_4_ =
                                         (fVar217 * (fVar247 + fVar176) -
                                         (fVar214 + fVar164) * fVar187) * fVar259 +
                                         ((fVar257 + fStack_1bdc) * fVar187 -
                                         (fVar247 + fVar176) * fVar233) * fStack_1c30 +
                                         (fVar233 * (fVar214 + fVar164) -
                                         (fVar257 + fStack_1bdc) * fVar217) * fVar252;
                                    aVar145._0_4_ = fVar189 + auVar210._0_4_ + auVar94._0_4_;
                                    aVar145._4_4_ = fVar192 + auVar210._4_4_ + auVar94._4_4_;
                                    aVar145._8_4_ = fVar205 + auVar210._8_4_ + auVar94._8_4_;
                                    aVar145._12_4_ = fVar215 + auVar210._12_4_ + auVar94._12_4_;
                                    auVar118._8_4_ = fVar205;
                                    auVar118._0_8_ = CONCAT44(fVar192,fVar189);
                                    auVar118._12_4_ = fVar215;
                                    auVar195 = minps(auVar118,auVar210);
                                    auVar195 = minps(auVar195,auVar94);
                                    auVar208 = maxps(auVar182,auVar210);
                                    auVar208 = maxps(auVar208,auVar94);
                                    fVar257 = ABS(aVar145._0_4_) * 1.1920929e-07;
                                    fVar261 = ABS(aVar145._4_4_) * 1.1920929e-07;
                                    fVar162 = ABS(aVar145._8_4_) * 1.1920929e-07;
                                    fVar152 = ABS(aVar145._12_4_) * 1.1920929e-07;
                                    auVar183._4_4_ = -(uint)(auVar208._4_4_ <= fVar261);
                                    auVar183._0_4_ = -(uint)(auVar208._0_4_ <= fVar257);
                                    auVar183._8_4_ = -(uint)(auVar208._8_4_ <= fVar162);
                                    auVar183._12_4_ = -(uint)(auVar208._12_4_ <= fVar152);
                                    auVar119._4_4_ = -(uint)(-fVar261 <= auVar195._4_4_);
                                    auVar119._0_4_ = -(uint)(-fVar257 <= auVar195._0_4_);
                                    auVar119._8_4_ = -(uint)(-fVar162 <= auVar195._8_4_);
                                    auVar119._12_4_ = -(uint)(-fVar152 <= auVar195._12_4_);
                                    auVar183 = auVar183 | auVar119;
                                    iVar50 = movmskps((int)pRVar57,auVar183);
                                    fStack_1c2c = fStack_1c30;
                                    if (iVar50 != 0) {
                                      auVar211._0_4_ = fVar235 * fVar161 - fVar74 * fVar134;
                                      auVar211._4_4_ = fVar239 * fVar203 - fVar103 * fVar102;
                                      auVar211._8_4_ = fVar248 * fVar244 - fVar147 * fVar132;
                                      auVar211._12_4_ = fVar253 * fVar186 - fVar150 * fVar149;
                                      auVar200._0_4_ = fVar74 * fVar174 - fVar190 * fVar161;
                                      auVar200._4_4_ = fVar103 * fVar212 - fVar193 * fVar203;
                                      auVar200._8_4_ = fVar147 * fVar250 - fVar213 * fVar244;
                                      auVar200._12_4_ = fVar150 * fVar187 - fVar217 * fVar186;
                                      auVar95._4_4_ =
                                           -(uint)(ABS(fVar103 * fVar102) < ABS(fVar193 * fVar203));
                                      auVar95._0_4_ =
                                           -(uint)(ABS(fVar74 * fVar134) < ABS(fVar190 * fVar161));
                                      auVar95._8_4_ =
                                           -(uint)(ABS(fVar147 * fVar132) < ABS(fVar213 * fVar244));
                                      auVar95._12_4_ =
                                           -(uint)(ABS(fVar150 * fVar149) < ABS(fVar217 * fVar186));
                                      auVar208 = blendvps(auVar200,auVar211,auVar95);
                                      auVar242._0_4_ = fVar134 * fVar237 - local_1b98 * fVar161;
                                      auVar242._4_4_ = fVar102 * fVar245 - fStack_1b94 * fVar203;
                                      auVar242._8_4_ = fVar132 * fVar251 - fStack_1b90 * fVar244;
                                      auVar242._12_4_ = fVar149 * fVar258 - fStack_1b8c * fVar186;
                                      auVar256._0_4_ = fVar222 * fVar161 - fVar237 * fVar174;
                                      auVar256._4_4_ = fVar225 * fVar203 - fVar245 * fVar212;
                                      auVar256._8_4_ = fVar229 * fVar244 - fVar251 * fVar250;
                                      auVar256._12_4_ = fVar233 * fVar186 - fVar258 * fVar187;
                                      auVar96._4_4_ =
                                           -(uint)(ABS(fStack_1b94 * fVar203) <
                                                  ABS(fVar245 * fVar212));
                                      auVar96._0_4_ =
                                           -(uint)(ABS(local_1b98 * fVar161) <
                                                  ABS(fVar237 * fVar174));
                                      auVar96._8_4_ =
                                           -(uint)(ABS(fStack_1b90 * fVar244) <
                                                  ABS(fVar251 * fVar250));
                                      auVar96._12_4_ =
                                           -(uint)(ABS(fStack_1b8c * fVar186) <
                                                  ABS(fVar258 * fVar187));
                                      auVar241 = blendvps(auVar256,auVar242,auVar96);
                                      auVar160._0_4_ = local_1b98 * fVar74 - fVar237 * fVar235;
                                      auVar160._4_4_ = fStack_1b94 * fVar103 - fVar245 * fVar239;
                                      auVar160._8_4_ = fStack_1b90 * fVar147 - fVar251 * fVar248;
                                      auVar160._12_4_ = fStack_1b8c * fVar150 - fVar258 * fVar253;
                                      auVar278._0_4_ = fVar237 * fVar190 - fVar222 * fVar74;
                                      auVar278._4_4_ = fVar245 * fVar193 - fVar225 * fVar103;
                                      auVar278._8_4_ = fVar251 * fVar213 - fVar229 * fVar147;
                                      auVar278._12_4_ = fVar258 * fVar217 - fVar233 * fVar150;
                                      auVar97._4_4_ =
                                           -(uint)(ABS(fVar245 * fVar239) < ABS(fVar225 * fVar103));
                                      auVar97._0_4_ =
                                           -(uint)(ABS(fVar237 * fVar235) < ABS(fVar222 * fVar74));
                                      auVar97._8_4_ =
                                           -(uint)(ABS(fVar251 * fVar248) < ABS(fVar229 * fVar147));
                                      auVar97._12_4_ =
                                           -(uint)(ABS(fVar258 * fVar253) < ABS(fVar233 * fVar150));
                                      auVar135 = blendvps(auVar278,auVar160,auVar97);
                                      fVar257 = fVar259 * auVar208._0_4_ +
                                                fStack_1c30 * auVar241._0_4_ +
                                                fVar252 * auVar135._0_4_;
                                      fVar261 = fVar259 * auVar208._4_4_ +
                                                fStack_1c30 * auVar241._4_4_ +
                                                fVar252 * auVar135._4_4_;
                                      fVar162 = fVar259 * auVar208._8_4_ +
                                                fStack_1c30 * auVar241._8_4_ +
                                                fVar252 * auVar135._8_4_;
                                      fVar252 = fVar259 * auVar208._12_4_ +
                                                fStack_1c30 * auVar241._12_4_ +
                                                fVar252 * auVar135._12_4_;
                                      auVar171._0_4_ = fVar257 + fVar257;
                                      auVar171._4_4_ = fVar261 + fVar261;
                                      auVar171._8_4_ = fVar162 + fVar162;
                                      auVar171._12_4_ = fVar252 + fVar252;
                                      auVar120._0_4_ =
                                           fVar188 * auVar241._0_4_ + fVar177 * auVar135._0_4_;
                                      auVar120._4_4_ =
                                           fVar191 * auVar241._4_4_ + fVar185 * auVar135._4_4_;
                                      auVar120._8_4_ =
                                           fVar216 * auVar241._8_4_ + fVar165 * auVar135._8_4_;
                                      auVar120._12_4_ =
                                           fVar106 * auVar241._12_4_ + fVar163 * auVar135._12_4_;
                                      fVar162 = fVar219 * auVar208._0_4_ + auVar120._0_4_;
                                      fVar152 = fVar274 * auVar208._4_4_ + auVar120._4_4_;
                                      fVar177 = fVar227 * auVar208._8_4_ + auVar120._8_4_;
                                      fVar164 = fVar292 * auVar208._12_4_ + auVar120._12_4_;
                                      auVar195 = rcpps(auVar120,auVar171);
                                      fVar252 = auVar195._0_4_;
                                      fVar257 = auVar195._4_4_;
                                      fVar259 = auVar195._8_4_;
                                      fVar261 = auVar195._12_4_;
                                      aVar98._0_4_ = ((1.0 - auVar171._0_4_ * fVar252) * fVar252 +
                                                     fVar252) * (fVar162 + fVar162);
                                      aVar98._4_4_ = ((1.0 - auVar171._4_4_ * fVar257) * fVar257 +
                                                     fVar257) * (fVar152 + fVar152);
                                      aVar98._8_4_ = ((1.0 - auVar171._8_4_ * fVar259) * fVar259 +
                                                     fVar259) * (fVar177 + fVar177);
                                      aVar98._12_4_ =
                                           ((1.0 - auVar171._12_4_ * fVar261) * fVar261 + fVar261) *
                                           (fVar164 + fVar164);
                                      fVar252 = *(float *)(ray + lVar53 * 4 + 0x80);
                                      fVar257 = *(float *)(ray + lVar53 * 4 + 0x30);
                                      auVar121._0_4_ =
                                           -(uint)(aVar98._0_4_ <= fVar252 &&
                                                  fVar257 <= aVar98._0_4_) & auVar183._0_4_;
                                      auVar121._4_4_ =
                                           -(uint)(aVar98._4_4_ <= fVar252 &&
                                                  fVar257 <= aVar98._4_4_) & auVar183._4_4_;
                                      auVar121._8_4_ =
                                           -(uint)(aVar98._8_4_ <= fVar252 &&
                                                  fVar257 <= aVar98._8_4_) & auVar183._8_4_;
                                      auVar121._12_4_ =
                                           -(uint)(aVar98._12_4_ <= fVar252 &&
                                                  fVar257 <= aVar98._12_4_) & auVar183._12_4_;
                                      iVar50 = movmskps(iVar50,auVar121);
                                      _local_1be8 = aVar145;
                                      if (iVar50 != 0) {
                                        aVar122._0_4_ =
                                             auVar121._0_4_ & -(uint)(auVar171._0_4_ != 0.0);
                                        aVar122._4_4_ =
                                             auVar121._4_4_ & -(uint)(auVar171._4_4_ != 0.0);
                                        aVar122._8_4_ =
                                             auVar121._8_4_ & -(uint)(auVar171._8_4_ != 0.0);
                                        aVar122._12_4_ =
                                             auVar121._12_4_ & -(uint)(auVar171._12_4_ != 0.0);
                                        iVar50 = movmskps(iVar50,(undefined1  [16])aVar122);
                                        if (iVar50 != 0) {
                                          hit.UVW.field_0 = aVar145;
                                          hit.mapUV = &mapUV;
                                          hit.valid.field_0 = aVar122;
                                          hit.vt.field_0 = aVar98;
                                          hit.vNg.field_0._0_16_ = auVar208;
                                          hit.vNg.field_0._16_16_ = auVar241;
                                          hit.vNg.field_0._32_16_ = auVar135;
                                          auVar146._0_4_ = aVar145._0_4_ - auVar210._0_4_;
                                          auVar146._4_4_ = aVar145._4_4_ - auVar210._4_4_;
                                          auVar146._8_4_ = aVar145._8_4_ - auVar210._8_4_;
                                          auVar146._12_4_ = aVar145._12_4_ - auVar210._12_4_;
                                          auVar123._4_12_ = aVar122._4_12_;
                                          auVar123._0_4_ =
                                               (float)(int)(*(ushort *)(lVar62 + 8 + lVar54) - 1);
                                          auVar172._4_4_ = aVar122._4_4_;
                                          auVar172._0_4_ = auVar123._0_4_;
                                          auVar172._8_4_ = aVar122._8_4_;
                                          auVar172._12_4_ = aVar122._12_4_;
                                          auVar195 = rcpss(auVar172,auVar123);
                                          fVar252 = (2.0 - auVar123._0_4_ * auVar195._0_4_) *
                                                    auVar195._0_4_;
                                          auVar173._4_12_ = auVar195._4_12_;
                                          auVar173._0_4_ =
                                               (float)(int)(*(ushort *)(lVar62 + 10 + lVar54) - 1);
                                          auVar184._4_4_ = auVar195._4_4_;
                                          auVar184._0_4_ = auVar173._0_4_;
                                          auVar184._8_4_ = auVar195._8_4_;
                                          auVar184._12_4_ = auVar195._12_4_;
                                          auVar195 = rcpss(auVar184,auVar173);
                                          fVar257 = (2.0 - auVar173._0_4_ * auVar195._0_4_) *
                                                    auVar195._0_4_;
                                          hit.U.field_0.v[0] =
                                               fVar252 * (aVar145._0_4_ * local_18e8 +
                                                         (aVar145._0_4_ - fVar189));
                                          hit.U.field_0.v[1] =
                                               fVar252 * (aVar145._4_4_ * fStack_18e4 +
                                                         (aVar145._4_4_ - fVar192));
                                          hit.U.field_0.v[2] =
                                               fVar252 * (aVar145._8_4_ * fStack_18e0 +
                                                         (aVar145._8_4_ - fVar205));
                                          hit.U.field_0.v[3] =
                                               fVar252 * (aVar145._12_4_ * fStack_18dc +
                                                         (aVar145._12_4_ - fVar215));
                                          hit.V.field_0._0_4_ =
                                               fVar257 * (aVar145._0_4_ * local_18f8 +
                                                         auVar146._0_4_);
                                          hit.V.field_0._4_4_ =
                                               fVar257 * (aVar145._4_4_ * fStack_18f4 +
                                                         auVar146._4_4_);
                                          hit.V.field_0._8_4_ =
                                               fVar257 * (aVar145._8_4_ * fStack_18f0 +
                                                         auVar146._8_4_);
                                          hit.V.field_0._12_4_ =
                                               fVar257 * (aVar145._12_4_ * fStack_18ec +
                                                         auVar146._12_4_);
                                          pGVar24 = (context->scene->geometries).items[uVar243].ptr;
                                          if ((pGVar24->mask & *(uint *)(ray + lVar53 * 4 + 0x90))
                                              != 0) {
                                            if ((context->args->filter == (RTCFilterFunctionN)0x0)
                                               && (pGVar24->occlusionFilterN ==
                                                   (RTCFilterFunctionN)0x0)) goto LAB_0025e034;
                                            auVar195 = rcpps(auVar146,(undefined1  [16])aVar145);
                                            fVar252 = auVar195._0_4_;
                                            fVar257 = auVar195._4_4_;
                                            fVar259 = auVar195._8_4_;
                                            fVar261 = auVar195._12_4_;
                                            fVar252 = (float)(-(uint)(1e-18 <= ABS(aVar145._0_4_)) &
                                                             (uint)(((float)DAT_01feca10 -
                                                                    aVar145._0_4_ * fVar252) *
                                                                    fVar252 + fVar252));
                                            fVar257 = (float)(-(uint)(1e-18 <= ABS(aVar145._4_4_)) &
                                                             (uint)((DAT_01feca10._4_4_ -
                                                                    aVar145._4_4_ * fVar257) *
                                                                    fVar257 + fVar257));
                                            fVar259 = (float)(-(uint)(1e-18 <= ABS(aVar145._8_4_)) &
                                                             (uint)((DAT_01feca10._8_4_ -
                                                                    aVar145._8_4_ * fVar259) *
                                                                    fVar259 + fVar259));
                                            fVar261 = (float)(-(uint)(1e-18 <= ABS(aVar145._12_4_))
                                                             & (uint)((DAT_01feca10._12_4_ -
                                                                      aVar145._12_4_ * fVar261) *
                                                                      fVar261 + fVar261));
                                            auVar99._0_4_ = hit.U.field_0.v[0] * fVar252;
                                            auVar99._4_4_ = hit.U.field_0.v[1] * fVar257;
                                            auVar99._8_4_ = hit.U.field_0.v[2] * fVar259;
                                            auVar99._12_4_ = hit.U.field_0.v[3] * fVar261;
                                            hit.vu.field_0 =
                                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                 minps(auVar99,_DAT_01feca10);
                                            auVar124._0_4_ = hit.V.field_0._0_4_ * fVar252;
                                            auVar124._4_4_ = hit.V.field_0._4_4_ * fVar257;
                                            auVar124._8_4_ = hit.V.field_0._8_4_ * fVar259;
                                            auVar124._12_4_ = hit.V.field_0._12_4_ * fVar261;
                                            hit.vv.field_0 =
                                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                 minps(auVar124,_DAT_01feca10);
                                            iVar50 = movmskps((int)&mapUV,(undefined1  [16])aVar122)
                                            ;
                                            uVar64 = CONCAT44((int)((ulong)&mapUV >> 0x20),iVar50);
                                            uVar71 = 0;
                                            if (uVar64 != 0) {
                                              for (; (uVar64 >> uVar71 & 1) == 0;
                                                  uVar71 = uVar71 + 1) {
                                              }
                                            }
                                            bVar73 = iVar50 == 0;
                                            if (!bVar73) {
                                              _local_1be8 = *(
                                                  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                                                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                                                  (mm_lookupmask_ps +
                                                  (long)(1 << ((byte)lVar53 & 0x1f)) * 0x10))->v;
                                              do {
                                                uVar59 = *(undefined4 *)(ray + lVar53 * 4 + 0x80);
                                                local_1978 = hit.vu.field_0.v[uVar71];
                                                iVar50 = hit.vv.field_0.i[uVar71];
                                                *(float *)(ray + lVar53 * 4 + 0x80) =
                                                     hit.vt.field_0.v[uVar71];
                                                args.context = context->user;
                                                local_1968._4_4_ = iVar50;
                                                local_1968._0_4_ = iVar50;
                                                local_1968._8_4_ = iVar50;
                                                local_1968._12_4_ = iVar50;
                                                local_19a8[0] =
                                                     *(float *)((long)&hit.vNg.field_0 + uVar71 * 4)
                                                ;
                                                uVar19 = *(undefined4 *)
                                                          ((long)&hit.vNg.field_0 +
                                                          uVar71 * 4 + 0x10);
                                                uVar20 = *(undefined4 *)
                                                          ((long)&hit.vNg.field_0 +
                                                          uVar71 * 4 + 0x20);
                                                local_1998._4_4_ = uVar19;
                                                local_1998._0_4_ = uVar19;
                                                local_1998._8_4_ = uVar19;
                                                local_1998._12_4_ = uVar19;
                                                local_1988._4_4_ = uVar20;
                                                local_1988._0_4_ = uVar20;
                                                local_1988._8_4_ = uVar20;
                                                local_1988._12_4_ = uVar20;
                                                local_19a8[1] = local_19a8[0];
                                                local_19a8[2] = local_19a8[0];
                                                local_19a8[3] = local_19a8[0];
                                                fStack_1974 = local_1978;
                                                fStack_1970 = local_1978;
                                                fStack_196c = local_1978;
                                                local_1958 = CONCAT44(uStack_1914,local_1918);
                                                uStack_1950 = CONCAT44(uStack_190c,uStack_1910);
                                                local_1948 = CONCAT44(uStack_1904,local_1908);
                                                uStack_1940 = CONCAT44(uStack_18fc,uStack_1900);
                                                local_1938 = (args.context)->instID[0];
                                                uStack_1934 = local_1938;
                                                uStack_1930 = local_1938;
                                                uStack_192c = local_1938;
                                                local_1928 = (args.context)->instPrimID[0];
                                                uStack_1924 = local_1928;
                                                uStack_1920 = local_1928;
                                                uStack_191c = local_1928;
                                                args.valid = (int *)local_1bd8;
                                                pRVar60 = (RTCIntersectArguments *)pGVar24->userPtr;
                                                args.hit = (RTCHitN *)local_19a8;
                                                args.N = 4;
                                                _local_1bd8 = _local_1be8;
                                                args.geometryUserPtr = pRVar60;
                                                args.ray = (RTCRayN *)ray;
                                                if (pGVar24->occlusionFilterN !=
                                                    (RTCFilterFunctionN)0x0) {
                                                  (*pGVar24->occlusionFilterN)(&args);
                                                }
                                                if (_local_1bd8 ==
                                                    (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                    0x0) {
                                                  auVar125._8_4_ = 0xffffffff;
                                                  auVar125._0_8_ = 0xffffffffffffffff;
                                                  auVar125._12_4_ = 0xffffffff;
                                                  auVar125 = auVar125 ^ _DAT_01febe20;
                                                }
                                                else {
                                                  pRVar60 = context->args;
                                                  if (((RTCIntersectArguments *)pRVar60->filter !=
                                                       (RTCIntersectArguments *)0x0) &&
                                                     ((((ulong)*(Scene **)&pRVar60->flags & 2) != 0
                                                      || (((pGVar24->field_8).field_0x2 & 0x40) != 0
                                                         )))) {
                                                    (*(code *)pRVar60->filter)(&args);
                                                  }
                                                  auVar100._0_4_ = -(uint)(local_1bd8._0_4_ == 0);
                                                  auVar100._4_4_ = -(uint)(local_1bd8._4_4_ == 0);
                                                  auVar100._8_4_ = -(uint)(iStack_1bd0 == 0);
                                                  auVar100._12_4_ = -(uint)(iStack_1bcc == 0);
                                                  auVar125 = auVar100 ^ _DAT_01febe20;
                                                  auVar195 = blendvps(_DAT_01feba00,
                                                                      *(undefined1 (*) [16])
                                                                       (args.ray + 0x80),auVar100);
                                                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar195
                                                  ;
                                                }
                                                if ((_DAT_01fecb20 & auVar125) !=
                                                    (undefined1  [16])0x0) {
                                                  if (!bVar73) goto LAB_0025e034;
                                                  break;
                                                }
                                                *(undefined4 *)(ray + lVar53 * 4 + 0x80) = uVar59;
                                                uVar64 = uVar64 ^ 1L << (uVar71 & 0x3f);
                                                uVar71 = 0;
                                                if (uVar64 != 0) {
                                                  for (; (uVar64 >> uVar71 & 1) == 0;
                                                      uVar71 = uVar71 + 1) {
                                                  }
                                                }
                                                bVar73 = uVar64 == 0;
                                              } while (!bVar73);
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    auVar199._0_4_ = fVar275 * fVar102 - fVar253 * fVar239;
                                    auVar199._4_4_ = fVar279 * fVar132 - fVar258 * fVar245;
                                    auVar199._8_4_ = fVar282 * fVar149 - fVar260 * fVar248;
                                    auVar199._12_4_ = fVar284 * fVar161 - fVar262 * fVar251;
                                    auVar240._0_4_ = fVar253 * fVar219 - fVar294 * fVar102;
                                    auVar240._4_4_ = fVar258 * fVar222 - fVar297 * fVar132;
                                    auVar240._8_4_ = fVar260 * fVar225 - fVar299 * fVar149;
                                    auVar240._12_4_ = fVar262 * fVar227 - fVar301 * fVar161;
                                    auVar89._4_4_ =
                                         -(uint)(ABS(fVar258 * fVar245) < ABS(fVar297 * fVar132));
                                    auVar89._0_4_ =
                                         -(uint)(ABS(fVar253 * fVar239) < ABS(fVar294 * fVar102));
                                    auVar89._8_4_ =
                                         -(uint)(ABS(fVar260 * fVar248) < ABS(fVar299 * fVar149));
                                    auVar89._12_4_ =
                                         -(uint)(ABS(fVar262 * fVar251) < ABS(fVar301 * fVar161));
                                    auVar241 = blendvps(auVar240,auVar199,auVar89);
                                    auVar267._0_4_ = fVar239 * fVar250 - fVar244 * fVar102;
                                    auVar267._4_4_ = fVar245 * fVar187 - fVar186 * fVar132;
                                    auVar267._8_4_ = fVar248 * fVar190 - fVar189 * fVar149;
                                    auVar267._12_4_ = fVar251 * fVar193 - fVar192 * fVar161;
                                    auVar277._0_4_ = fVar276 * fVar102 - fVar250 * fVar219;
                                    auVar277._4_4_ = fVar280 * fVar132 - fVar187 * fVar222;
                                    auVar277._8_4_ = fVar283 * fVar149 - fVar190 * fVar225;
                                    auVar277._12_4_ = fVar285 * fVar161 - fVar193 * fVar227;
                                    auVar90._4_4_ =
                                         -(uint)(ABS(fVar186 * fVar132) < ABS(fVar187 * fVar222));
                                    auVar90._0_4_ =
                                         -(uint)(ABS(fVar244 * fVar102) < ABS(fVar250 * fVar219));
                                    auVar90._8_4_ =
                                         -(uint)(ABS(fVar189 * fVar149) < ABS(fVar190 * fVar225));
                                    auVar90._12_4_ =
                                         -(uint)(ABS(fVar192 * fVar161) < ABS(fVar193 * fVar227));
                                    auVar135 = blendvps(auVar277,auVar267,auVar90);
                                    auVar157._0_4_ = fVar244 * fVar253 - fVar250 * fVar275;
                                    auVar157._4_4_ = fVar186 * fVar258 - fVar187 * fVar279;
                                    auVar157._8_4_ = fVar189 * fVar260 - fVar190 * fVar282;
                                    auVar157._12_4_ = fVar192 * fVar262 - fVar193 * fVar284;
                                    auVar181._0_4_ = fVar250 * fVar294 - fVar276 * fVar253;
                                    auVar181._4_4_ = fVar187 * fVar297 - fVar280 * fVar258;
                                    auVar181._8_4_ = fVar190 * fVar299 - fVar283 * fVar260;
                                    auVar181._12_4_ = fVar193 * fVar301 - fVar285 * fVar262;
                                    aVar48.v[1] = fVar165;
                                    aVar48.v[0] = fVar185;
                                    aVar48.v[2] = fVar176;
                                    aVar48.v[3] = fVar188;
                                    auVar91._4_4_ =
                                         -(uint)(ABS(fVar187 * fVar279) < ABS(fVar280 * fVar258));
                                    auVar91._0_4_ =
                                         -(uint)(ABS(fVar250 * fVar275) < ABS(fVar276 * fVar253));
                                    auVar91._8_4_ =
                                         -(uint)(ABS(fVar190 * fVar282) < ABS(fVar283 * fVar260));
                                    auVar91._12_4_ =
                                         -(uint)(ABS(fVar193 * fVar284) < ABS(fVar285 * fVar262));
                                    auVar208 = blendvps(auVar181,auVar157,auVar91);
                                    fVar257 = fVar162 * auVar241._0_4_ +
                                              fStack_1b94 * auVar135._0_4_ +
                                              fVar261 * auVar208._0_4_;
                                    fVar259 = fVar162 * auVar241._4_4_ +
                                              fStack_1b94 * auVar135._4_4_ +
                                              fVar261 * auVar208._4_4_;
                                    fVar152 = fVar162 * auVar241._8_4_ +
                                              fStack_1b94 * auVar135._8_4_ +
                                              fVar261 * auVar208._8_4_;
                                    fVar261 = fVar162 * auVar241._12_4_ +
                                              fStack_1b94 * auVar135._12_4_ +
                                              fVar261 * auVar208._12_4_;
                                    auVar231._0_4_ = fVar257 + fVar257;
                                    auVar231._4_4_ = fVar259 + fVar259;
                                    auVar231._8_4_ = fVar152 + fVar152;
                                    auVar231._12_4_ = fVar261 + fVar261;
                                    auVar112._0_4_ =
                                         fVar229 * auVar135._0_4_ + fVar174 * auVar208._0_4_;
                                    auVar112._4_4_ =
                                         fVar233 * auVar135._4_4_ + fVar201 * auVar208._4_4_;
                                    auVar112._8_4_ =
                                         fVar235 * auVar135._8_4_ + fVar203 * auVar208._8_4_;
                                    auVar112._12_4_ =
                                         fVar237 * auVar135._12_4_ + fVar212 * auVar208._12_4_;
                                    fVar261 = fVar205 * auVar241._0_4_ + auVar112._0_4_;
                                    fVar162 = fVar213 * auVar241._4_4_ + auVar112._4_4_;
                                    fVar191 = fVar215 * auVar241._8_4_ + auVar112._8_4_;
                                    fVar216 = fVar217 * auVar241._12_4_ + auVar112._12_4_;
                                    auVar195 = rcpps(auVar112,auVar231);
                                    fVar257 = auVar195._0_4_;
                                    fVar259 = auVar195._4_4_;
                                    fVar152 = auVar195._8_4_;
                                    fVar177 = auVar195._12_4_;
                                    auVar158._0_4_ = fVar261 + fVar261;
                                    auVar158._4_4_ = fVar162 + fVar162;
                                    auVar158._8_4_ = fVar191 + fVar191;
                                    auVar158._12_4_ = fVar216 + fVar216;
                                    fVar261 = ((1.0 - auVar231._0_4_ * fVar257) * fVar257 + fVar257)
                                              * auVar158._0_4_;
                                    fVar162 = ((1.0 - auVar231._4_4_ * fVar259) * fVar259 + fVar259)
                                              * auVar158._4_4_;
                                    fVar152 = ((1.0 - auVar231._8_4_ * fVar152) * fVar152 + fVar152)
                                              * auVar158._8_4_;
                                    fVar177 = ((1.0 - auVar231._12_4_ * fVar177) * fVar177 + fVar177
                                              ) * auVar158._12_4_;
                                    fVar257 = *(float *)(ray + lVar53 * 4 + 0x80);
                                    fVar259 = *(float *)(ray + lVar53 * 4 + 0x30);
                                    auVar113._0_4_ =
                                         -(uint)(fVar261 <= fVar257 && fVar259 <= fVar261) &
                                         auVar255._0_4_;
                                    auVar113._4_4_ =
                                         -(uint)(fVar162 <= fVar257 && fVar259 <= fVar162) &
                                         auVar255._4_4_;
                                    auVar113._8_4_ =
                                         -(uint)(fVar152 <= fVar257 && fVar259 <= fVar152) &
                                         auVar255._8_4_;
                                    auVar113._12_4_ =
                                         -(uint)(fVar177 <= fVar257 && fVar259 <= fVar177) &
                                         auVar255._12_4_;
                                    uVar228 = movmskps(uVar228,auVar113);
                                    pRVar57 = (RTCIntersectArguments *)(ulong)uVar228;
                                    if (uVar228 == 0) goto LAB_0025daa2;
                                    aVar114._0_4_ = auVar113._0_4_ & -(uint)(auVar231._0_4_ != 0.0);
                                    aVar114._4_4_ = auVar113._4_4_ & -(uint)(auVar231._4_4_ != 0.0);
                                    aVar114._8_4_ = auVar113._8_4_ & -(uint)(auVar231._8_4_ != 0.0);
                                    aVar114._12_4_ =
                                         auVar113._12_4_ & -(uint)(auVar231._12_4_ != 0.0);
                                    uVar228 = movmskps(uVar228,(undefined1  [16])aVar114);
                                    pRVar57 = (RTCIntersectArguments *)(ulong)uVar228;
                                    if (uVar228 == 0) goto LAB_0025daa2;
                                    hit.UVW.field_0 = aVar48;
                                    hit.valid.field_0 = aVar114;
                                    hit.vt.field_0.v[1] = fVar162;
                                    hit.vt.field_0.v[0] = fVar261;
                                    hit.vt.field_0.v[2] = fVar152;
                                    hit.vt.field_0.v[3] = fVar177;
                                    hit.vNg.field_0._0_16_ = auVar241;
                                    hit.vNg.field_0._16_16_ = auVar135;
                                    hit.vNg.field_0._32_16_ = auVar208;
                                    auVar115._4_12_ = aVar114._4_12_;
                                    auVar115._0_4_ =
                                         (float)(int)(*(ushort *)(lVar62 + 8 + lVar54) - 1);
                                    auVar142._4_4_ = aVar114._4_4_;
                                    auVar142._0_4_ = auVar115._0_4_;
                                    auVar142._8_4_ = aVar114._8_4_;
                                    auVar142._12_4_ = aVar114._12_4_;
                                    auVar195 = rcpss(auVar142,auVar115);
                                    auVar159._4_12_ = auVar158._4_12_;
                                    auVar159._0_4_ =
                                         (float)(int)(*(ushort *)(lVar62 + 10 + lVar54) - 1);
                                    fVar257 = (2.0 - auVar115._0_4_ * auVar195._0_4_) *
                                              auVar195._0_4_;
                                    auVar143._4_4_ = auVar158._4_4_;
                                    auVar143._0_4_ = auVar159._0_4_;
                                    auVar143._8_4_ = auVar158._8_4_;
                                    auVar143._12_4_ = auVar158._12_4_;
                                    auVar195 = rcpss(auVar143,auVar159);
                                    fVar259 = (2.0 - auVar159._0_4_ * auVar195._0_4_) *
                                              auVar195._0_4_;
                                    hit.U.field_0.v[0] = fVar257 * (fVar185 * local_18e8 + fVar264);
                                    hit.U.field_0.v[1] = fVar257 * (fVar165 * fStack_18e4 + fVar271)
                                    ;
                                    hit.U.field_0.v[2] = fVar257 * (fVar176 * fStack_18e0 + fVar272)
                                    ;
                                    hit.U.field_0.v[3] = fVar257 * (fVar188 * fStack_18dc + fVar273)
                                    ;
                                    auVar144._0_4_ = fVar185 * local_18f8 + auVar156._0_4_;
                                    auVar144._4_4_ = fVar165 * fStack_18f4 + auVar156._4_4_;
                                    auVar144._8_4_ = fVar176 * fStack_18f0 + auVar156._8_4_;
                                    auVar144._12_4_ = fVar188 * fStack_18ec + auVar156._12_4_;
                                    hit.V.field_0._0_4_ = fVar259 * auVar144._0_4_;
                                    hit.V.field_0._4_4_ = fVar259 * auVar144._4_4_;
                                    hit.V.field_0._8_4_ = fVar259 * auVar144._8_4_;
                                    hit.V.field_0._12_4_ = fVar259 * auVar144._12_4_;
                                    pGVar24 = (context->scene->geometries).items[uVar243].ptr;
                                    pRVar57 = (RTCIntersectArguments *)
                                              (ulong)*(uint *)(ray + lVar53 * 4 + 0x90);
                                    if ((pGVar24->mask & *(uint *)(ray + lVar53 * 4 + 0x90)) == 0)
                                    goto LAB_0025daa2;
                                    pRVar57 = context->args;
                                    fStack_1b90 = fStack_1b94;
                                    fStack_1b8c = fStack_1b94;
                                    if ((pRVar57->filter != (RTCFilterFunctionN)0x0) ||
                                       (local_1b98 = fStack_1b94,
                                       pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar195 = rcpps(auVar144,(undefined1  [16])aVar48);
                                      fVar257 = auVar195._0_4_;
                                      fVar259 = auVar195._4_4_;
                                      fVar261 = auVar195._8_4_;
                                      fVar162 = auVar195._12_4_;
                                      fVar257 = (float)(-(uint)(1e-18 <= ABS(fVar185)) &
                                                       (uint)(((float)DAT_01feca10 -
                                                              fVar185 * fVar257) * fVar257 + fVar257
                                                             ));
                                      fVar259 = (float)(-(uint)(1e-18 <= ABS(fVar165)) &
                                                       (uint)((DAT_01feca10._4_4_ -
                                                              fVar165 * fVar259) * fVar259 + fVar259
                                                             ));
                                      fVar261 = (float)(-(uint)(1e-18 <= ABS(fVar176)) &
                                                       (uint)((DAT_01feca10._8_4_ -
                                                              fVar176 * fVar261) * fVar261 + fVar261
                                                             ));
                                      fVar162 = (float)(-(uint)(1e-18 <= ABS(fVar188)) &
                                                       (uint)((DAT_01feca10._12_4_ -
                                                              fVar188 * fVar162) * fVar162 + fVar162
                                                             ));
                                      auVar92._0_4_ = hit.U.field_0.v[0] * fVar257;
                                      auVar92._4_4_ = hit.U.field_0.v[1] * fVar259;
                                      auVar92._8_4_ = hit.U.field_0.v[2] * fVar261;
                                      auVar92._12_4_ = hit.U.field_0.v[3] * fVar162;
                                      hit.vu.field_0 =
                                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                           minps(auVar92,_DAT_01feca10);
                                      auVar116._0_4_ = hit.V.field_0._0_4_ * fVar257;
                                      auVar116._4_4_ = hit.V.field_0._4_4_ * fVar259;
                                      auVar116._8_4_ = hit.V.field_0._8_4_ * fVar261;
                                      auVar116._12_4_ = hit.V.field_0._12_4_ * fVar162;
                                      hit.vv.field_0 =
                                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                           minps(auVar116,_DAT_01feca10);
                                      iVar50 = movmskps((int)lVar69,(undefined1  [16])aVar114);
                                      uVar64 = CONCAT44((int)((ulong)lVar69 >> 0x20),iVar50);
                                      uVar71 = 0;
                                      if (uVar64 != 0) {
                                        for (; (uVar64 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1) {
                                        }
                                      }
                                      local_1b98._1_3_ = (undefined3)((uint)fStack_1b94 >> 8);
                                      local_1b98 = (float)CONCAT31(local_1b98._1_3_,iVar50 == 0);
                                      if (iVar50 != 0) {
                                        lVar56 = (long)(1 << ((byte)lVar53 & 0x1f)) * 0x10;
                                        auVar49 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar56);
                                        uStack_1bec = (undefined4)
                                                      ((ulong)*(undefined8 *)
                                                               (mm_lookupmask_ps + lVar56 + 8) >>
                                                      0x20);
                                        do {
                                          uVar59 = *(undefined4 *)(ray + lVar53 * 4 + 0x80);
                                          local_1978 = hit.vu.field_0.v[uVar71];
                                          iVar50 = hit.vv.field_0.i[uVar71];
                                          *(float *)(ray + lVar53 * 4 + 0x80) =
                                               hit.vt.field_0.v[uVar71];
                                          args.context = context->user;
                                          local_1968._4_4_ = iVar50;
                                          local_1968._0_4_ = iVar50;
                                          local_1968._8_4_ = iVar50;
                                          local_1968._12_4_ = iVar50;
                                          local_19a8[0] =
                                               *(float *)((long)&hit.vNg.field_0 + uVar71 * 4);
                                          uVar19 = *(undefined4 *)
                                                    ((long)&hit.vNg.field_0 + uVar71 * 4 + 0x10);
                                          uVar20 = *(undefined4 *)
                                                    ((long)&hit.vNg.field_0 + uVar71 * 4 + 0x20);
                                          local_1998._4_4_ = uVar19;
                                          local_1998._0_4_ = uVar19;
                                          local_1998._8_4_ = uVar19;
                                          local_1998._12_4_ = uVar19;
                                          local_1988._4_4_ = uVar20;
                                          local_1988._0_4_ = uVar20;
                                          local_1988._8_4_ = uVar20;
                                          local_1988._12_4_ = uVar20;
                                          local_19a8[1] = local_19a8[0];
                                          local_19a8[2] = local_19a8[0];
                                          local_19a8[3] = local_19a8[0];
                                          fStack_1974 = local_1978;
                                          fStack_1970 = local_1978;
                                          fStack_196c = local_1978;
                                          local_1958 = CONCAT44(uStack_1914,local_1918);
                                          uStack_1950 = CONCAT44(uStack_190c,uStack_1910);
                                          local_1948 = CONCAT44(uStack_1904,local_1908);
                                          uStack_1940 = CONCAT44(uStack_18fc,uStack_1900);
                                          local_1938 = (args.context)->instID[0];
                                          uStack_1934 = local_1938;
                                          uStack_1930 = local_1938;
                                          uStack_192c = local_1938;
                                          local_1928 = (args.context)->instPrimID[0];
                                          uStack_1924 = local_1928;
                                          uStack_1920 = local_1928;
                                          uStack_191c = local_1928;
                                          iStack_1bcc = uStack_1bec;
                                          _local_1bd8 = auVar49;
                                          args.valid = (int *)local_1bd8;
                                          pRVar60 = (RTCIntersectArguments *)pGVar24->userPtr;
                                          args.hit = (RTCHitN *)local_19a8;
                                          args.N = 4;
                                          pRVar57 = (RTCIntersectArguments *)
                                                    pGVar24->occlusionFilterN;
                                          args.geometryUserPtr = pRVar60;
                                          args.ray = (RTCRayN *)ray;
                                          if (pRVar57 != (RTCIntersectArguments *)0x0) {
                                            pRVar57 = (RTCIntersectArguments *)
                                                      (*(code *)pRVar57)(&args);
                                            lVar62 = local_1ba8;
                                            lVar54 = local_1bb0;
                                          }
                                          if (_local_1bd8 ==
                                              (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                            auVar117._8_4_ = 0xffffffff;
                                            auVar117._0_8_ = 0xffffffffffffffff;
                                            auVar117._12_4_ = 0xffffffff;
                                            auVar117 = auVar117 ^ _DAT_01febe20;
                                          }
                                          else {
                                            pRVar60 = context->args;
                                            if (((RTCIntersectArguments *)pRVar60->filter !=
                                                 (RTCIntersectArguments *)0x0) &&
                                               ((((ulong)*(Scene **)&pRVar60->flags & 2) != 0 ||
                                                (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                                              (*(code *)pRVar60->filter)(&args);
                                              lVar62 = local_1ba8;
                                              lVar54 = local_1bb0;
                                            }
                                            auVar93._0_4_ = -(uint)(local_1bd8._0_4_ == 0);
                                            auVar93._4_4_ = -(uint)(local_1bd8._4_4_ == 0);
                                            auVar93._8_4_ = -(uint)(iStack_1bd0 == 0);
                                            auVar93._12_4_ = -(uint)(iStack_1bcc == 0);
                                            auVar117 = auVar93 ^ _DAT_01febe20;
                                            auVar195 = blendvps(_DAT_01feba00,
                                                                *(undefined1 (*) [16])
                                                                 (args.ray + 0x80),auVar93);
                                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar195;
                                            pRVar57 = (RTCIntersectArguments *)args.ray;
                                          }
                                          if ((_DAT_01fecb20 & auVar117) != (undefined1  [16])0x0) {
                                            if (((uint)local_1b98 & 1) == 0) goto LAB_0025e034;
                                            break;
                                          }
                                          *(undefined4 *)(ray + lVar53 * 4 + 0x80) = uVar59;
                                          uVar64 = uVar64 ^ 1L << (uVar71 & 0x3f);
                                          uVar71 = 0;
                                          if (uVar64 != 0) {
                                            for (; (uVar64 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1)
                                            {
                                            }
                                          }
                                          local_1b98 = (float)CONCAT31(local_1b98._1_3_,uVar64 == 0)
                                          ;
                                        } while (uVar64 != 0);
                                      }
                                      goto LAB_0025daa2;
                                    }
LAB_0025e034:
                                    valid0.field_0.v[lVar53] = 0.0;
                                  }
                                  uVar71 = uVar51 - 1;
                                  uVar51 = uVar51 & uVar71;
                                } while (uVar51 != 0);
                              }
                              aVar266._0_4_ = aVar266.i[0] & valid0.field_0.i[0];
                              aVar266._4_4_ = uVar246 & valid0.field_0.i[1];
                              aVar266._8_4_ = uVar249 & valid0.field_0.i[2];
                              aVar266._12_4_ = uVar223 & valid0.field_0.i[3];
                              iVar50 = movmskps((int)uVar71,(undefined1  [16])aVar266);
                              bVar73 = iVar50 == 0;
                              fVar252 = INFINITY;
                              fVar257 = INFINITY;
                              fVar259 = INFINITY;
                              fVar261 = INFINITY;
                              NVar61.ptr = local_1bb8.ptr;
                              pNVar65 = local_1bc0;
                              pvVar67 = local_1bc8;
                            }
                          } while ((!bVar73) &&
                                  (valid_i = (vint<4> *)
                                             ((ulong)valid_i &
                                             (ulong)((long)&(((Intersectors *)
                                                             ((long)valid_i + -0x118))->
                                                            intersector16_nofilter).name + 7U)),
                                  (Intersectors *)valid_i != (Intersectors *)0x0));
                        }
                        lVar58 = lVar58 + 1;
                      } while (lVar58 != lVar52);
                      aVar268._0_8_ = aVar266._0_8_ ^ 0xffffffffffffffff;
                      aVar268._8_4_ = aVar266.i[2] ^ 0xffffffff;
                      aVar268._12_4_ = aVar266.i[3] ^ 0xffffffff;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         ((undefined1  [16])aVar268 | (undefined1  [16])terminated.field_0);
                    iVar50 = movmskps((int)lVar58,(undefined1  [16])terminated.field_0);
                    if (iVar50 == 0xf) goto LAB_0025e3d7;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                  (undefined1  [16])terminated.field_0);
                    sVar302 = 0;
                    break;
                  }
                  goto LAB_0025e3e8;
                }
                uVar51 = local_1bb8.ptr & 0xfffffffffffffff0;
                uVar243 = (uint)local_1bb8.ptr & 7;
                bVar73 = fVar162 < tray.tfar.field_0.v[0];
                bVar31 = fVar151 < tray.tfar.field_0.v[1];
                bVar32 = fVar133 < tray.tfar.field_0.v[2];
                bVar33 = fVar148 < tray.tfar.field_0.v[3];
                local_1bb8.ptr = 8;
                uVar71 = 0;
                fVar162 = fVar252;
                fVar151 = fVar257;
                fVar133 = fVar259;
                fVar148 = fVar261;
                do {
                  uVar64 = *(ulong *)(uVar51 + uVar71 * 8);
                  if (uVar64 != 8) {
                    fVar104 = *(float *)(uVar51 + 0x80 + uVar71 * 4);
                    fVar152 = *(float *)(uVar51 + 0x20 + uVar71 * 4);
                    fVar177 = *(float *)(uVar51 + 0x30 + uVar71 * 4);
                    fVar164 = *(float *)(uVar51 + 0x40 + uVar71 * 4);
                    fVar185 = *(float *)(uVar51 + 0x50 + uVar71 * 4);
                    auVar195 = *(undefined1 (*) [16])(ray + 0x70);
                    fVar132 = auVar195._0_4_;
                    fVar147 = auVar195._4_4_;
                    fVar149 = auVar195._8_4_;
                    fVar150 = auVar195._12_4_;
                    fVar165 = *(float *)(uVar51 + 0xa0 + uVar71 * 4);
                    fVar176 = *(float *)(uVar51 + 0xc0 + uVar71 * 4);
                    fVar188 = *(float *)(uVar51 + 0x60 + uVar71 * 4);
                    fVar191 = *(float *)(uVar51 + 0x90 + uVar71 * 4);
                    fVar216 = *(float *)(uVar51 + 0xb0 + uVar71 * 4);
                    fVar106 = *(float *)(uVar51 + 0xd0 + uVar71 * 4);
                    fVar134 = *(float *)(uVar51 + 0x70 + uVar71 * 4);
                    fVar244 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
                    fVar250 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
                    fVar74 = ((fVar104 * fVar132 + fVar152) - (float)tray.org.field_0._0_4_) *
                             tray.rdir.field_0._0_4_;
                    fVar102 = ((fVar104 * fVar147 + fVar152) - (float)tray.org.field_0._4_4_) *
                              tray.rdir.field_0._4_4_;
                    fVar103 = ((fVar104 * fVar149 + fVar152) - (float)tray.org.field_0._8_4_) *
                              tray.rdir.field_0._8_4_;
                    fVar104 = ((fVar104 * fVar150 + fVar152) - (float)tray.org.field_0._12_4_) *
                              tray.rdir.field_0._12_4_;
                    fVar152 = ((fVar165 * fVar132 + fVar164) - (float)tray.org.field_0._16_4_) *
                              tray.rdir.field_0._16_4_;
                    fVar161 = ((fVar165 * fVar147 + fVar164) - (float)tray.org.field_0._20_4_) *
                              tray.rdir.field_0._20_4_;
                    fVar163 = ((fVar165 * fVar149 + fVar164) - (float)tray.org.field_0._24_4_) *
                              tray.rdir.field_0._24_4_;
                    fVar164 = ((fVar165 * fVar150 + fVar164) - (float)tray.org.field_0._28_4_) *
                              tray.rdir.field_0._28_4_;
                    fVar165 = ((fVar176 * fVar132 + fVar188) - (float)tray.org.field_0._32_8_) *
                              tray.rdir.field_0._32_4_;
                    fVar174 = ((fVar176 * fVar147 + fVar188) - fVar244) * tray.rdir.field_0._36_4_;
                    fVar175 = ((fVar176 * fVar149 + fVar188) - (float)tray.org.field_0._40_8_) *
                              tray.rdir.field_0._40_4_;
                    fVar176 = ((fVar176 * fVar150 + fVar188) - fVar250) * tray.rdir.field_0._44_4_;
                    fVar194 = ((fVar191 * fVar132 + fVar177) - (float)tray.org.field_0._0_4_) *
                              tray.rdir.field_0._0_4_;
                    fVar201 = ((fVar191 * fVar147 + fVar177) - (float)tray.org.field_0._4_4_) *
                              tray.rdir.field_0._4_4_;
                    fVar202 = ((fVar191 * fVar149 + fVar177) - (float)tray.org.field_0._8_4_) *
                              tray.rdir.field_0._8_4_;
                    fVar203 = ((fVar191 * fVar150 + fVar177) - (float)tray.org.field_0._12_4_) *
                              tray.rdir.field_0._12_4_;
                    fVar204 = ((fVar216 * fVar132 + fVar185) - (float)tray.org.field_0._16_4_) *
                              tray.rdir.field_0._16_4_;
                    fVar212 = ((fVar216 * fVar147 + fVar185) - (float)tray.org.field_0._20_4_) *
                              tray.rdir.field_0._20_4_;
                    fVar214 = ((fVar216 * fVar149 + fVar185) - (float)tray.org.field_0._24_4_) *
                              tray.rdir.field_0._24_4_;
                    fVar216 = ((fVar216 * fVar150 + fVar185) - (float)tray.org.field_0._28_4_) *
                              tray.rdir.field_0._28_4_;
                    fVar177 = ((fVar106 * fVar132 + fVar134) - (float)tray.org.field_0._32_8_) *
                              tray.rdir.field_0._32_4_;
                    fVar185 = ((fVar106 * fVar147 + fVar134) - fVar244) * tray.rdir.field_0._36_4_;
                    fVar188 = ((fVar106 * fVar149 + fVar134) - (float)tray.org.field_0._40_8_) *
                              tray.rdir.field_0._40_4_;
                    fVar191 = ((fVar106 * fVar150 + fVar134) - fVar250) * tray.rdir.field_0._44_4_;
                    uVar246 = (uint)((int)fVar194 < (int)fVar74) * (int)fVar194 |
                              (uint)((int)fVar194 >= (int)fVar74) * (int)fVar74;
                    uVar249 = (uint)((int)fVar201 < (int)fVar102) * (int)fVar201 |
                              (uint)((int)fVar201 >= (int)fVar102) * (int)fVar102;
                    uVar223 = (uint)((int)fVar202 < (int)fVar103) * (int)fVar202 |
                              (uint)((int)fVar202 >= (int)fVar103) * (int)fVar103;
                    uVar226 = (uint)((int)fVar203 < (int)fVar104) * (int)fVar203 |
                              (uint)((int)fVar203 >= (int)fVar104) * (int)fVar104;
                    uVar228 = (uint)((int)fVar204 < (int)fVar152) * (int)fVar204 |
                              (uint)((int)fVar204 >= (int)fVar152) * (int)fVar152;
                    uVar232 = (uint)((int)fVar212 < (int)fVar161) * (int)fVar212 |
                              (uint)((int)fVar212 >= (int)fVar161) * (int)fVar161;
                    uVar234 = (uint)((int)fVar214 < (int)fVar163) * (int)fVar214 |
                              (uint)((int)fVar214 >= (int)fVar163) * (int)fVar163;
                    uVar236 = (uint)((int)fVar216 < (int)fVar164) * (int)fVar216 |
                              (uint)((int)fVar216 >= (int)fVar164) * (int)fVar164;
                    uVar228 = ((int)uVar228 < (int)uVar246) * uVar246 |
                              ((int)uVar228 >= (int)uVar246) * uVar228;
                    uVar232 = ((int)uVar232 < (int)uVar249) * uVar249 |
                              ((int)uVar232 >= (int)uVar249) * uVar232;
                    uVar234 = ((int)uVar234 < (int)uVar223) * uVar223 |
                              ((int)uVar234 >= (int)uVar223) * uVar234;
                    uVar236 = ((int)uVar236 < (int)uVar226) * uVar226 |
                              ((int)uVar236 >= (int)uVar226) * uVar236;
                    uVar246 = (uint)((int)fVar177 < (int)fVar165) * (int)fVar177 |
                              (uint)((int)fVar177 >= (int)fVar165) * (int)fVar165;
                    uVar249 = (uint)((int)fVar185 < (int)fVar174) * (int)fVar185 |
                              (uint)((int)fVar185 >= (int)fVar174) * (int)fVar174;
                    uVar223 = (uint)((int)fVar188 < (int)fVar175) * (int)fVar188 |
                              (uint)((int)fVar188 >= (int)fVar175) * (int)fVar175;
                    uVar226 = (uint)((int)fVar191 < (int)fVar176) * (int)fVar191 |
                              (uint)((int)fVar191 >= (int)fVar176) * (int)fVar176;
                    auVar221._0_4_ =
                         (float)(((int)uVar246 < (int)uVar228) * uVar228 |
                                ((int)uVar246 >= (int)uVar228) * uVar246) * 0.99999964;
                    auVar221._4_4_ =
                         (float)(((int)uVar249 < (int)uVar232) * uVar232 |
                                ((int)uVar249 >= (int)uVar232) * uVar249) * 0.99999964;
                    auVar221._8_4_ =
                         (float)(((int)uVar223 < (int)uVar234) * uVar234 |
                                ((int)uVar223 >= (int)uVar234) * uVar223) * 0.99999964;
                    auVar221._12_4_ =
                         (float)(((int)uVar226 < (int)uVar236) * uVar236 |
                                ((int)uVar226 >= (int)uVar236) * uVar226) * 0.99999964;
                    uVar246 = (uint)((int)fVar194 < (int)fVar74) * (int)fVar74 |
                              (uint)((int)fVar194 >= (int)fVar74) * (int)fVar194;
                    uVar249 = (uint)((int)fVar201 < (int)fVar102) * (int)fVar102 |
                              (uint)((int)fVar201 >= (int)fVar102) * (int)fVar201;
                    uVar223 = (uint)((int)fVar202 < (int)fVar103) * (int)fVar103 |
                              (uint)((int)fVar202 >= (int)fVar103) * (int)fVar202;
                    uVar226 = (uint)((int)fVar203 < (int)fVar104) * (int)fVar104 |
                              (uint)((int)fVar203 >= (int)fVar104) * (int)fVar203;
                    uVar228 = (uint)((int)fVar204 < (int)fVar152) * (int)fVar152 |
                              (uint)((int)fVar204 >= (int)fVar152) * (int)fVar204;
                    uVar232 = (uint)((int)fVar212 < (int)fVar161) * (int)fVar161 |
                              (uint)((int)fVar212 >= (int)fVar161) * (int)fVar212;
                    uVar234 = (uint)((int)fVar214 < (int)fVar163) * (int)fVar163 |
                              (uint)((int)fVar214 >= (int)fVar163) * (int)fVar214;
                    uVar236 = (uint)((int)fVar216 < (int)fVar164) * (int)fVar164 |
                              (uint)((int)fVar216 >= (int)fVar164) * (int)fVar216;
                    uVar228 = ((int)uVar246 < (int)uVar228) * uVar246 |
                              ((int)uVar246 >= (int)uVar228) * uVar228;
                    uVar232 = ((int)uVar249 < (int)uVar232) * uVar249 |
                              ((int)uVar249 >= (int)uVar232) * uVar232;
                    uVar234 = ((int)uVar223 < (int)uVar234) * uVar223 |
                              ((int)uVar223 >= (int)uVar234) * uVar234;
                    uVar236 = ((int)uVar226 < (int)uVar236) * uVar226 |
                              ((int)uVar226 >= (int)uVar236) * uVar236;
                    uVar246 = (uint)((int)fVar177 < (int)fVar165) * (int)fVar165 |
                              (uint)((int)fVar177 >= (int)fVar165) * (int)fVar177;
                    uVar249 = (uint)((int)fVar185 < (int)fVar174) * (int)fVar174 |
                              (uint)((int)fVar185 >= (int)fVar174) * (int)fVar185;
                    uVar223 = (uint)((int)fVar188 < (int)fVar175) * (int)fVar175 |
                              (uint)((int)fVar188 >= (int)fVar175) * (int)fVar188;
                    uVar226 = (uint)((int)fVar191 < (int)fVar176) * (int)fVar176 |
                              (uint)((int)fVar191 >= (int)fVar176) * (int)fVar191;
                    fVar104 = (float)(((int)uVar228 < (int)uVar246) * uVar228 |
                                     ((int)uVar228 >= (int)uVar246) * uVar246) * 1.0000004;
                    fVar152 = (float)(((int)uVar232 < (int)uVar249) * uVar232 |
                                     ((int)uVar232 >= (int)uVar249) * uVar249) * 1.0000004;
                    fVar177 = (float)(((int)uVar234 < (int)uVar223) * uVar234 |
                                     ((int)uVar234 >= (int)uVar223) * uVar223) * 1.0000004;
                    fVar164 = (float)(((int)uVar236 < (int)uVar226) * uVar236 |
                                     ((int)uVar236 >= (int)uVar226) * uVar226) * 1.0000004;
                    bVar72 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar221._0_4_) *
                                     (int)auVar221._0_4_ |
                                    (uint)(tray.tnear.field_0.i[0] >= (int)auVar221._0_4_) *
                                    tray.tnear.field_0.i[0]) <=
                             (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar104) *
                                     tray.tfar.field_0.i[0] |
                                    (uint)(tray.tfar.field_0.i[0] >= (int)fVar104) * (int)fVar104);
                    bVar28 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar221._4_4_) *
                                     (int)auVar221._4_4_ |
                                    (uint)(tray.tnear.field_0.i[1] >= (int)auVar221._4_4_) *
                                    tray.tnear.field_0.i[1]) <=
                             (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar152) *
                                     tray.tfar.field_0.i[1] |
                                    (uint)(tray.tfar.field_0.i[1] >= (int)fVar152) * (int)fVar152);
                    bVar29 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar221._8_4_) *
                                     (int)auVar221._8_4_ |
                                    (uint)(tray.tnear.field_0.i[2] >= (int)auVar221._8_4_) *
                                    tray.tnear.field_0.i[2]) <=
                             (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar177) *
                                     tray.tfar.field_0.i[2] |
                                    (uint)(tray.tfar.field_0.i[2] >= (int)fVar177) * (int)fVar177);
                    bVar30 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar221._12_4_) *
                                     (int)auVar221._12_4_ |
                                    (uint)(tray.tnear.field_0.i[3] >= (int)auVar221._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                             (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar164) *
                                     tray.tfar.field_0.i[3] |
                                    (uint)(tray.tfar.field_0.i[3] >= (int)fVar164) * (int)fVar164);
                    if (uVar243 == 6) {
                      fVar104 = *(float *)(uVar51 + 0xe0 + uVar71 * 4);
                      fVar152 = *(float *)(uVar51 + 0xf0 + uVar71 * 4);
                      bVar72 = (fVar132 < fVar152 && fVar104 <= fVar132) && bVar72;
                      bVar28 = (fVar147 < fVar152 && fVar104 <= fVar147) && bVar28;
                      bVar29 = (fVar149 < fVar152 && fVar104 <= fVar149) && bVar29;
                      bVar30 = (fVar150 < fVar152 && fVar104 <= fVar150) && bVar30;
                    }
                    auVar77._0_4_ = (-(uint)bVar72 & -(uint)bVar73) << 0x1f;
                    auVar77._4_4_ = (-(uint)bVar28 & -(uint)bVar31) << 0x1f;
                    auVar77._8_4_ = (-(uint)bVar29 & -(uint)bVar32) << 0x1f;
                    auVar77._12_4_ = (-(uint)bVar30 & -(uint)bVar33) << 0x1f;
                    uVar246 = movmskps((int)valid_i,auVar77);
                    valid_i = (vint<4> *)(ulong)uVar246;
                    if (uVar246 != 0) {
                      auVar136._4_4_ = fVar257;
                      auVar136._0_4_ = fVar252;
                      auVar136._8_4_ = fVar259;
                      auVar136._12_4_ = fVar261;
                      auVar195 = blendvps(auVar136,auVar221,auVar77);
                      if (local_1bb8.ptr != 8) {
                        pNVar65->ptr = local_1bb8.ptr;
                        pNVar65 = pNVar65 + 1;
                        (pvVar67->field_0).v[0] = fVar162;
                        (pvVar67->field_0).v[1] = fVar151;
                        (pvVar67->field_0).v[2] = fVar133;
                        (pvVar67->field_0).v[3] = fVar148;
                        pvVar67 = pvVar67 + 1;
                      }
                      fVar162 = auVar195._0_4_;
                      fVar151 = auVar195._4_4_;
                      fVar133 = auVar195._8_4_;
                      fVar148 = auVar195._12_4_;
                      local_1bb8.ptr = uVar64;
                    }
                  }
                } while ((uVar64 != 8) && (bVar72 = uVar71 < 3, uVar71 = uVar71 + 1, bVar72));
                sVar302 = 0;
                if (local_1bb8.ptr == 8) {
LAB_0025c9a9:
                  pRVar60 = (RTCIntersectArguments *)0x0;
                  sVar302 = 4;
                }
                else {
                  auVar78._4_4_ = -(uint)(fVar151 < tray.tfar.field_0.v[1]);
                  auVar78._0_4_ = -(uint)(fVar162 < tray.tfar.field_0.v[0]);
                  auVar78._8_4_ = -(uint)(fVar133 < tray.tfar.field_0.v[2]);
                  auVar78._12_4_ = -(uint)(fVar148 < tray.tfar.field_0.v[3]);
                  uVar59 = movmskps(uVar243,auVar78);
                  pRVar60 = (RTCIntersectArguments *)CONCAT71((uint7)(uint3)((uint)uVar59 >> 8),1);
                  if ((uint)POPCOUNT(uVar59) <= uVar238) {
                    pNVar65->ptr = local_1bb8.ptr;
                    pNVar65 = pNVar65 + 1;
                    (pvVar67->field_0).v[0] = fVar162;
                    (pvVar67->field_0).v[1] = fVar151;
                    (pvVar67->field_0).v[2] = fVar133;
                    (pvVar67->field_0).v[3] = fVar148;
                    pvVar67 = pvVar67 + 1;
                    goto LAB_0025c9a9;
                  }
                }
              } while ((char)pRVar60 != '\0');
            }
          }
        }
        pvVar66 = pvVar67;
      } while ((int)sVar302 != 3);
      auVar101._0_4_ = uVar263 & terminated.field_0.i[0];
      auVar101._4_4_ = uVar269 & terminated.field_0.i[1];
      auVar101._8_4_ = auVar265._8_4_ & terminated.field_0.i[2];
      auVar101._12_4_ = auVar265._12_4_ & terminated.field_0.i[3];
      auVar195 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar101);
      *(undefined1 (*) [16])(ray + 0x80) = auVar195;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }